

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void idct32x32_low16_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  undefined1 auVar18 [16];
  int iVar32;
  int iVar33;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  undefined1 auVar41 [16];
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  uint uVar73;
  uint uVar74;
  uint uVar75;
  uint uVar76;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int iVar77;
  int iVar92;
  int iVar96;
  undefined1 auVar81 [16];
  int iVar100;
  undefined1 auVar82 [16];
  int iVar78;
  int iVar93;
  int iVar97;
  int iVar101;
  undefined1 auVar83 [16];
  uint uVar79;
  uint uVar80;
  uint uVar94;
  uint uVar95;
  uint uVar98;
  uint uVar99;
  uint uVar102;
  uint uVar103;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  int iVar104;
  uint uVar106;
  int iVar114;
  uint uVar116;
  int iVar117;
  uint uVar119;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  int iVar120;
  undefined1 auVar109 [16];
  int iVar105;
  int iVar115;
  int iVar118;
  int iVar121;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  uint uVar122;
  int iVar123;
  uint uVar125;
  int iVar133;
  uint uVar135;
  int iVar136;
  uint uVar138;
  undefined1 auVar126 [16];
  int iVar139;
  undefined1 auVar127 [16];
  int iVar124;
  int iVar134;
  int iVar137;
  int iVar140;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  uint uVar141;
  int iVar142;
  uint uVar145;
  int iVar154;
  uint uVar157;
  int iVar158;
  uint uVar161;
  undefined1 auVar146 [16];
  int iVar162;
  undefined1 auVar147 [16];
  int iVar143;
  int iVar155;
  int iVar159;
  int iVar163;
  undefined1 auVar148 [16];
  int iVar144;
  int iVar156;
  int iVar160;
  int iVar164;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  uint uVar165;
  int iVar166;
  int iVar180;
  int iVar184;
  undefined1 auVar169 [16];
  int iVar188;
  undefined1 auVar170 [16];
  int iVar181;
  int iVar185;
  int iVar189;
  undefined1 auVar171 [16];
  int iVar167;
  uint uVar168;
  int iVar182;
  uint uVar183;
  int iVar186;
  uint uVar187;
  int iVar190;
  uint uVar191;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  int iVar192;
  uint uVar195;
  int iVar200;
  int iVar203;
  uint uVar204;
  int iVar205;
  int iVar208;
  uint uVar209;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  int iVar210;
  undefined1 auVar198 [16];
  int iVar193;
  uint uVar194;
  int iVar201;
  uint uVar202;
  int iVar206;
  uint uVar207;
  int iVar211;
  uint uVar212;
  undefined1 auVar199 [16];
  uint uVar213;
  int iVar214;
  uint uVar215;
  int iVar222;
  uint uVar223;
  int iVar224;
  uint uVar225;
  undefined1 auVar216 [16];
  int iVar226;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  uint uVar227;
  int iVar228;
  int iVar237;
  int iVar238;
  undefined1 auVar229 [16];
  int iVar239;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  uint uVar240;
  uint uVar242;
  uint uVar243;
  undefined1 auVar241 [16];
  uint uVar244;
  int iVar245;
  int iVar253;
  int iVar254;
  undefined1 auVar246 [16];
  int iVar255;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  int iVar256;
  uint uVar258;
  int iVar265;
  uint uVar267;
  int iVar268;
  uint uVar270;
  undefined1 auVar259 [16];
  int iVar271;
  undefined1 auVar260 [16];
  int iVar257;
  int iVar266;
  int iVar269;
  int iVar272;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  uint uVar273;
  int iVar274;
  int iVar276;
  int iVar277;
  undefined1 auVar275 [16];
  int iVar278;
  int iVar279;
  int iVar281;
  int iVar282;
  undefined1 auVar280 [16];
  int iVar283;
  uint uVar284;
  uint uVar285;
  uint uVar287;
  uint uVar288;
  uint uVar289;
  uint uVar290;
  undefined1 auVar286 [16];
  uint uVar291;
  uint uVar292;
  __m128i clamp_hi;
  __m128i clamp_lo;
  __m128i bf1 [32];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  uint local_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  uint local_228;
  uint uStack_224;
  uint uStack_220;
  uint uStack_21c;
  uint local_218;
  uint uStack_214;
  uint uStack_210;
  uint uStack_20c;
  uint local_208;
  uint uStack_204;
  uint uStack_200;
  uint uStack_1fc;
  uint local_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint local_1e8;
  uint uStack_1e4;
  uint uStack_1e0;
  uint uStack_1dc;
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint local_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint local_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint local_188;
  uint uStack_184;
  uint uStack_180;
  uint uStack_17c;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint local_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  uint local_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint local_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  uint local_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint local_128;
  uint uStack_124;
  uint uStack_120;
  uint uStack_11c;
  uint local_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint local_108;
  uint uStack_104;
  uint uStack_100;
  uint uStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  lVar7 = (long)bit * 0x100;
  iVar13 = -*(int *)((long)vert_filter_length_chroma + lVar7 + 0x248);
  iVar14 = -*(int *)((long)vert_filter_length_chroma + lVar7 + 0x208);
  auVar286 = ZEXT416((uint)bit);
  iVar124 = -*(int *)((long)vert_filter_length_chroma + lVar7 + 0x228);
  iVar123 = -*(int *)((long)vert_filter_length_chroma + lVar7 + 0x1e8);
  iVar15 = -*(int *)((long)vert_filter_length_chroma + lVar7 + 0x230);
  iVar12 = -*(int *)((long)vert_filter_length_chroma + lVar7 + 0x1f0);
  iVar16 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x240);
  iVar20 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x1c0);
  iVar8 = 1 << ((char)bit - 1U & 0x1f);
  iVar22 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x200);
  iVar27 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x180);
  iVar3 = -iVar22;
  iVar11 = -iVar27;
  iVar10 = -iVar16;
  iVar2 = -iVar20;
  iVar17 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x1e0);
  iVar4 = -iVar17;
  iVar203 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x220);
  iVar5 = -iVar203;
  iVar208 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x1a0);
  iVar6 = -iVar208;
  iVar9 = bd + 6 + (uint)(do_cols == 0) * 2;
  local_258 = 0x8000;
  if (0xf < iVar9) {
    local_258 = 1 << ((char)iVar9 - 1U & 0x1f);
  }
  local_248 = -local_258;
  local_258 = local_258 + -1;
  uStack_22c = (uint)((ulong)(*in)[1] >> 0x20);
  uStack_20c = (uint)((ulong)in[8][1] >> 0x20);
  uStack_1ec = (uint)((ulong)in[4][1] >> 0x20);
  uStack_1ac = (uint)((ulong)in[2][1] >> 0x20);
  uStack_12c = (uint)((ulong)in[1][1] >> 0x20);
  iStack_ac = (int)((ulong)in[3][1] >> 0x20);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 600);
  auVar126._4_4_ = uVar1;
  auVar126._0_4_ = uVar1;
  auVar126._8_4_ = uVar1;
  auVar126._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x1d8);
  auVar146._4_4_ = uVar1;
  auVar146._0_4_ = uVar1;
  auVar146._8_4_ = uVar1;
  auVar146._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x218);
  auVar196._4_4_ = uVar1;
  auVar196._0_4_ = uVar1;
  auVar196._8_4_ = uVar1;
  auVar196._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x1a8);
  auVar169._4_4_ = uVar1;
  auVar169._0_4_ = uVar1;
  auVar169._8_4_ = uVar1;
  auVar169._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x168);
  auVar107._4_4_ = uVar1;
  auVar107._0_4_ = uVar1;
  auVar107._8_4_ = uVar1;
  auVar107._12_4_ = uVar1;
  auVar280._4_4_ = iVar123;
  auVar280._0_4_ = iVar123;
  auVar280._8_4_ = iVar123;
  auVar280._12_4_ = iVar123;
  auVar130._12_4_ = uStack_12c;
  auVar130._0_12_ = *(undefined1 (*) [12])in[1];
  auVar108 = pmulld(auVar107,auVar130);
  iVar104 = auVar108._0_4_ + iVar8 >> auVar286;
  iVar114 = auVar108._4_4_ + iVar8 >> auVar286;
  iVar117 = auVar108._8_4_ + iVar8 >> auVar286;
  iVar120 = auVar108._12_4_ + iVar8 >> auVar286;
  auVar108 = pmulld(auVar126,auVar130);
  iVar123 = auVar108._0_4_ + iVar8 >> auVar286;
  iVar133 = auVar108._4_4_ + iVar8 >> auVar286;
  iVar136 = auVar108._8_4_ + iVar8 >> auVar286;
  iVar139 = auVar108._12_4_ + iVar8 >> auVar286;
  auVar108 = pmulld(auVar280,(undefined1  [16])in[0xf]);
  iVar279 = auVar108._0_4_ + iVar8 >> auVar286;
  iVar281 = auVar108._4_4_ + iVar8 >> auVar286;
  iVar282 = auVar108._8_4_ + iVar8 >> auVar286;
  iVar283 = auVar108._12_4_ + iVar8 >> auVar286;
  auVar108 = pmulld(auVar146,(undefined1  [16])in[0xf]);
  iVar142 = auVar108._0_4_ + iVar8 >> auVar286;
  iVar154 = auVar108._4_4_ + iVar8 >> auVar286;
  iVar158 = auVar108._8_4_ + iVar8 >> auVar286;
  iVar162 = auVar108._12_4_ + iVar8 >> auVar286;
  auVar108 = pmulld(auVar169,(undefined1  [16])in[9]);
  auVar197 = pmulld(auVar196,(undefined1  [16])in[9]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x198);
  auVar199._4_4_ = uVar1;
  auVar199._0_4_ = uVar1;
  auVar199._8_4_ = uVar1;
  auVar199._12_4_ = uVar1;
  auVar216._4_4_ = iVar124;
  auVar216._0_4_ = iVar124;
  auVar216._8_4_ = iVar124;
  auVar216._12_4_ = iVar124;
  iVar166 = auVar108._0_4_ + iVar8 >> auVar286;
  iVar180 = auVar108._4_4_ + iVar8 >> auVar286;
  iVar184 = auVar108._8_4_ + iVar8 >> auVar286;
  iVar188 = auVar108._12_4_ + iVar8 >> auVar286;
  iVar192 = auVar197._0_4_ + iVar8 >> auVar286;
  iVar200 = auVar197._4_4_ + iVar8 >> auVar286;
  iVar205 = auVar197._8_4_ + iVar8 >> auVar286;
  iVar210 = auVar197._12_4_ + iVar8 >> auVar286;
  auVar197 = pmulld(auVar216,(undefined1  [16])in[7]);
  auVar108 = pmulld(auVar199,(undefined1  [16])in[7]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x238);
  auVar246._4_4_ = uVar1;
  auVar246._0_4_ = uVar1;
  auVar246._8_4_ = uVar1;
  auVar246._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x188);
  auVar81._4_4_ = uVar1;
  auVar81._0_4_ = uVar1;
  auVar81._8_4_ = uVar1;
  auVar81._12_4_ = uVar1;
  iVar214 = auVar197._0_4_ + iVar8 >> auVar286;
  iVar222 = auVar197._4_4_ + iVar8 >> auVar286;
  iVar224 = auVar197._8_4_ + iVar8 >> auVar286;
  iVar226 = auVar197._12_4_ + iVar8 >> auVar286;
  iVar32 = auVar108._0_4_ + iVar8 >> auVar286;
  iVar45 = auVar108._4_4_ + iVar8 >> auVar286;
  iVar55 = auVar108._8_4_ + iVar8 >> auVar286;
  iVar66 = auVar108._12_4_ + iVar8 >> auVar286;
  auVar108 = pmulld(auVar81,(undefined1  [16])in[5]);
  auVar197 = pmulld(auVar246,(undefined1  [16])in[5]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x1b8);
  auVar198._4_4_ = uVar1;
  auVar198._0_4_ = uVar1;
  auVar198._8_4_ = uVar1;
  auVar198._12_4_ = uVar1;
  iVar77 = auVar108._0_4_ + iVar8 >> auVar286;
  iVar92 = auVar108._4_4_ + iVar8 >> auVar286;
  iVar96 = auVar108._8_4_ + iVar8 >> auVar286;
  iVar100 = auVar108._12_4_ + iVar8 >> auVar286;
  auVar127._4_4_ = iVar14;
  auVar127._0_4_ = iVar14;
  auVar127._8_4_ = iVar14;
  auVar127._12_4_ = iVar14;
  iVar245 = auVar197._0_4_ + iVar8 >> auVar286;
  iVar253 = auVar197._4_4_ + iVar8 >> auVar286;
  iVar254 = auVar197._8_4_ + iVar8 >> auVar286;
  iVar255 = auVar197._12_4_ + iVar8 >> auVar286;
  auVar108 = pmulld(auVar127,(undefined1  [16])in[0xb]);
  auVar197 = pmulld(auVar198,(undefined1  [16])in[0xb]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x1f8);
  auVar218._4_4_ = uVar1;
  auVar218._0_4_ = uVar1;
  auVar218._8_4_ = uVar1;
  auVar218._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x1c8);
  auVar82._4_4_ = uVar1;
  auVar82._0_4_ = uVar1;
  auVar82._8_4_ = uVar1;
  auVar82._12_4_ = uVar1;
  iVar124 = auVar108._0_4_ + iVar8 >> auVar286;
  iVar134 = auVar108._4_4_ + iVar8 >> auVar286;
  iVar137 = auVar108._8_4_ + iVar8 >> auVar286;
  iVar140 = auVar108._12_4_ + iVar8 >> auVar286;
  iVar193 = auVar197._0_4_ + iVar8 >> auVar286;
  iVar201 = auVar197._4_4_ + iVar8 >> auVar286;
  iVar206 = auVar197._8_4_ + iVar8 >> auVar286;
  iVar211 = auVar197._12_4_ + iVar8 >> auVar286;
  auVar197 = pmulld(auVar82,(undefined1  [16])in[0xd]);
  auVar108 = pmulld(auVar218,(undefined1  [16])in[0xd]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x178);
  auVar170._4_4_ = uVar1;
  auVar170._0_4_ = uVar1;
  auVar170._8_4_ = uVar1;
  auVar170._12_4_ = uVar1;
  auVar229._4_4_ = iVar13;
  auVar229._0_4_ = iVar13;
  auVar229._8_4_ = iVar13;
  auVar229._12_4_ = iVar13;
  iVar78 = auVar197._0_4_ + iVar8 >> auVar286;
  iVar93 = auVar197._4_4_ + iVar8 >> auVar286;
  iVar97 = auVar197._8_4_ + iVar8 >> auVar286;
  iVar101 = auVar197._12_4_ + iVar8 >> auVar286;
  iVar33 = auVar108._0_4_ + iVar8 >> auVar286;
  iVar46 = auVar108._4_4_ + iVar8 >> auVar286;
  iVar56 = auVar108._8_4_ + iVar8 >> auVar286;
  iVar67 = auVar108._12_4_ + iVar8 >> auVar286;
  auVar132._12_4_ = iStack_ac;
  auVar132._0_12_ = *(undefined1 (*) [12])in[3];
  auVar197 = pmulld(auVar229,auVar132);
  auVar108 = pmulld(auVar170,auVar132);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x250);
  auVar150._4_4_ = uVar1;
  auVar150._0_4_ = uVar1;
  auVar150._8_4_ = uVar1;
  auVar150._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x170);
  auVar147._4_4_ = uVar1;
  auVar147._0_4_ = uVar1;
  auVar147._8_4_ = uVar1;
  auVar147._12_4_ = uVar1;
  iVar228 = auVar197._0_4_ + iVar8 >> auVar286;
  iVar237 = auVar197._4_4_ + iVar8 >> auVar286;
  iVar238 = auVar197._8_4_ + iVar8 >> auVar286;
  iVar239 = auVar197._12_4_ + iVar8 >> auVar286;
  iVar9 = auVar108._0_4_ + iVar8 >> auVar286;
  iVar181 = auVar108._4_4_ + iVar8 >> auVar286;
  iVar185 = auVar108._8_4_ + iVar8 >> auVar286;
  iVar189 = auVar108._12_4_ + iVar8 >> auVar286;
  auVar88._12_4_ = uStack_1ac;
  auVar88._0_12_ = *(undefined1 (*) [12])in[2];
  auVar197 = pmulld(auVar147,auVar88);
  auVar108 = pmulld(auVar150,auVar88);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x1d0);
  auVar259._4_4_ = uVar1;
  auVar259._0_4_ = uVar1;
  auVar259._8_4_ = uVar1;
  auVar259._12_4_ = uVar1;
  iVar143 = auVar197._0_4_ + iVar8 >> auVar286;
  iVar155 = auVar197._4_4_ + iVar8 >> auVar286;
  iVar159 = auVar197._8_4_ + iVar8 >> auVar286;
  iVar163 = auVar197._12_4_ + iVar8 >> auVar286;
  auVar148._4_4_ = iVar12;
  auVar148._0_4_ = iVar12;
  auVar148._8_4_ = iVar12;
  auVar148._12_4_ = iVar12;
  iVar12 = auVar108._0_4_ + iVar8 >> auVar286;
  iVar19 = auVar108._4_4_ + iVar8 >> auVar286;
  iVar21 = auVar108._8_4_ + iVar8 >> auVar286;
  iVar26 = auVar108._12_4_ + iVar8 >> auVar286;
  auVar108 = pmulld(auVar148,(undefined1  [16])in[0xe]);
  auVar197 = pmulld(auVar259,(undefined1  [16])in[0xe]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x210);
  auVar109._4_4_ = uVar1;
  auVar109._0_4_ = uVar1;
  auVar109._8_4_ = uVar1;
  auVar109._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x1b0);
  auVar171._4_4_ = uVar1;
  auVar171._0_4_ = uVar1;
  auVar171._8_4_ = uVar1;
  auVar171._12_4_ = uVar1;
  iVar144 = auVar108._0_4_ + iVar8 >> auVar286;
  iVar156 = auVar108._4_4_ + iVar8 >> auVar286;
  iVar160 = auVar108._8_4_ + iVar8 >> auVar286;
  iVar164 = auVar108._12_4_ + iVar8 >> auVar286;
  iVar256 = auVar197._0_4_ + iVar8 >> auVar286;
  iVar265 = auVar197._4_4_ + iVar8 >> auVar286;
  iVar268 = auVar197._8_4_ + iVar8 >> auVar286;
  iVar271 = auVar197._12_4_ + iVar8 >> auVar286;
  auVar197 = pmulld(auVar171,(undefined1  [16])in[10]);
  auVar108 = pmulld(auVar109,(undefined1  [16])in[10]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 400);
  auVar275._4_4_ = uVar1;
  auVar275._0_4_ = uVar1;
  auVar275._8_4_ = uVar1;
  auVar275._12_4_ = uVar1;
  auVar260._4_4_ = iVar15;
  auVar260._0_4_ = iVar15;
  auVar260._8_4_ = iVar15;
  auVar260._12_4_ = iVar15;
  iVar167 = auVar197._0_4_ + iVar8 >> auVar286;
  iVar182 = auVar197._4_4_ + iVar8 >> auVar286;
  iVar186 = auVar197._8_4_ + iVar8 >> auVar286;
  iVar190 = auVar197._12_4_ + iVar8 >> auVar286;
  iVar105 = auVar108._0_4_ + iVar8 >> auVar286;
  iVar115 = auVar108._4_4_ + iVar8 >> auVar286;
  iVar118 = auVar108._8_4_ + iVar8 >> auVar286;
  iVar121 = auVar108._12_4_ + iVar8 >> auVar286;
  auVar108 = pmulld(auVar260,(undefined1  [16])in[6]);
  auVar197 = pmulld(auVar275,(undefined1  [16])in[6]);
  iVar274 = iVar279 + iVar123;
  iVar276 = iVar281 + iVar133;
  iVar277 = iVar282 + iVar136;
  iVar278 = iVar283 + iVar139;
  iVar123 = iVar123 - iVar279;
  iVar133 = iVar133 - iVar281;
  iVar136 = iVar136 - iVar282;
  iVar139 = iVar139 - iVar283;
  iVar13 = iVar214 + iVar192;
  iVar279 = iVar222 + iVar200;
  iVar281 = iVar224 + iVar205;
  iVar282 = iVar226 + iVar210;
  iVar214 = iVar214 - iVar192;
  iVar222 = iVar222 - iVar200;
  iVar224 = iVar224 - iVar205;
  iVar226 = iVar226 - iVar210;
  iVar14 = iVar124 + iVar245;
  iVar192 = iVar134 + iVar253;
  iVar200 = iVar137 + iVar254;
  iVar205 = iVar140 + iVar255;
  iVar245 = iVar245 - iVar124;
  iVar253 = iVar253 - iVar134;
  iVar254 = iVar254 - iVar137;
  iVar255 = iVar255 - iVar140;
  iVar124 = iVar228 + iVar33;
  iVar134 = iVar237 + iVar46;
  iVar137 = iVar238 + iVar56;
  iVar140 = iVar239 + iVar67;
  iVar228 = iVar228 - iVar33;
  iVar237 = iVar237 - iVar46;
  iVar238 = iVar238 - iVar56;
  iVar239 = iVar239 - iVar67;
  iVar210 = iVar9 + iVar78;
  iVar283 = iVar181 + iVar93;
  iVar57 = iVar185 + iVar97;
  iVar68 = iVar189 + iVar101;
  iVar9 = iVar9 - iVar78;
  iVar181 = iVar181 - iVar93;
  iVar185 = iVar185 - iVar97;
  iVar189 = iVar189 - iVar101;
  iVar101 = iVar193 + iVar77;
  iVar47 = iVar201 + iVar92;
  iVar58 = iVar206 + iVar96;
  iVar69 = iVar211 + iVar100;
  iVar77 = iVar77 - iVar193;
  iVar92 = iVar92 - iVar201;
  iVar96 = iVar96 - iVar206;
  iVar100 = iVar100 - iVar211;
  iVar193 = iVar32 + iVar166;
  iVar201 = iVar45 + iVar180;
  iVar206 = iVar55 + iVar184;
  iVar211 = iVar66 + iVar188;
  iVar32 = iVar32 - iVar166;
  iVar45 = iVar45 - iVar180;
  iVar55 = iVar55 - iVar184;
  iVar66 = iVar66 - iVar188;
  iVar166 = iVar142 + iVar104;
  iVar180 = iVar154 + iVar114;
  iVar184 = iVar158 + iVar117;
  iVar188 = iVar162 + iVar120;
  iVar104 = iVar104 - iVar142;
  iVar114 = iVar114 - iVar154;
  iVar117 = iVar117 - iVar158;
  iVar120 = iVar120 - iVar162;
  iVar257 = auVar108._0_4_ + iVar8 >> auVar286;
  iVar266 = auVar108._4_4_ + iVar8 >> auVar286;
  iVar269 = auVar108._8_4_ + iVar8 >> auVar286;
  iVar272 = auVar108._12_4_ + iVar8 >> auVar286;
  iVar142 = iVar144 + iVar12;
  iVar154 = iVar156 + iVar19;
  iVar158 = iVar160 + iVar21;
  iVar162 = iVar164 + iVar26;
  iVar12 = iVar12 - iVar144;
  iVar19 = iVar19 - iVar156;
  iVar21 = iVar21 - iVar160;
  iVar26 = iVar26 - iVar164;
  iVar15 = iVar257 + iVar105;
  iVar46 = iVar266 + iVar115;
  iVar67 = iVar269 + iVar118;
  iVar93 = iVar272 + iVar121;
  iVar257 = iVar257 - iVar105;
  iVar266 = iVar266 - iVar115;
  iVar269 = iVar269 - iVar118;
  iVar272 = iVar272 - iVar121;
  local_418._0_4_ = auVar197._0_4_;
  local_418._4_4_ = auVar197._4_4_;
  local_418._8_4_ = auVar197._8_4_;
  local_418._12_4_ = auVar197._12_4_;
  iVar33 = local_418._0_4_ + iVar8 >> auVar286;
  iVar56 = local_418._4_4_ + iVar8 >> auVar286;
  iVar78 = local_418._8_4_ + iVar8 >> auVar286;
  iVar97 = local_418._12_4_ + iVar8 >> auVar286;
  iVar105 = iVar33 + iVar167;
  iVar118 = iVar56 + iVar182;
  iVar144 = iVar78 + iVar186;
  iVar160 = iVar97 + iVar190;
  iVar33 = iVar33 - iVar167;
  iVar56 = iVar56 - iVar182;
  iVar78 = iVar78 - iVar186;
  iVar97 = iVar97 - iVar190;
  iVar115 = iVar256 + iVar143;
  iVar121 = iVar265 + iVar155;
  iVar156 = iVar268 + iVar159;
  iVar164 = iVar271 + iVar163;
  iVar143 = iVar143 - iVar256;
  iVar155 = iVar155 - iVar265;
  iVar159 = iVar159 - iVar268;
  iVar163 = iVar163 - iVar271;
  auVar151._4_4_ = iVar16;
  auVar151._0_4_ = iVar16;
  auVar151._8_4_ = iVar16;
  auVar151._12_4_ = iVar16;
  auVar231._4_4_ = iVar11;
  auVar231._0_4_ = iVar11;
  auVar231._8_4_ = iVar11;
  auVar231._12_4_ = iVar11;
  uVar168 = (uint)(iVar123 < local_248) * local_248 | (uint)(iVar123 >= local_248) * iVar123;
  uVar183 = (uint)(iVar133 < local_248) * local_248 | (uint)(iVar133 >= local_248) * iVar133;
  uVar187 = (uint)(iVar136 < local_248) * local_248 | (uint)(iVar136 >= local_248) * iVar136;
  uVar191 = (uint)(iVar139 < local_248) * local_248 | (uint)(iVar139 >= local_248) * iVar139;
  auVar172._0_4_ =
       (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  auVar172._4_4_ =
       (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  auVar172._8_4_ =
       (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  auVar172._12_4_ =
       (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar168 = (uint)(iVar104 < local_248) * local_248 | (uint)(iVar104 >= local_248) * iVar104;
  uVar183 = (uint)(iVar114 < local_248) * local_248 | (uint)(iVar114 >= local_248) * iVar114;
  uVar187 = (uint)(iVar117 < local_248) * local_248 | (uint)(iVar117 >= local_248) * iVar117;
  uVar191 = (uint)(iVar120 < local_248) * local_248 | (uint)(iVar120 >= local_248) * iVar120;
  auVar149._0_4_ =
       (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  auVar149._4_4_ =
       (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  auVar149._8_4_ =
       (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  auVar149._12_4_ =
       (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  auVar83 = pmulld(auVar172,auVar231);
  auVar41 = pmulld(auVar149,auVar151);
  auVar128._4_4_ = iVar27;
  auVar128._0_4_ = iVar27;
  auVar128._8_4_ = iVar27;
  auVar128._12_4_ = iVar27;
  uVar168 = (uint)(iVar274 < local_248) * local_248 | (uint)(iVar274 >= local_248) * iVar274;
  uVar183 = (uint)(iVar276 < local_248) * local_248 | (uint)(iVar276 >= local_248) * iVar276;
  uVar187 = (uint)(iVar277 < local_248) * local_248 | (uint)(iVar277 >= local_248) * iVar277;
  uVar191 = (uint)(iVar278 < local_248) * local_248 | (uint)(iVar278 >= local_248) * iVar278;
  uVar34 = (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  uVar48 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uVar59 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uVar70 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar168 = (uint)(iVar13 < local_248) * local_248 | (uint)(iVar13 >= local_248) * iVar13;
  uVar183 = (uint)(iVar279 < local_248) * local_248 | (uint)(iVar279 >= local_248) * iVar279;
  uVar187 = (uint)(iVar281 < local_248) * local_248 | (uint)(iVar281 >= local_248) * iVar281;
  uVar191 = (uint)(iVar282 < local_248) * local_248 | (uint)(iVar282 >= local_248) * iVar282;
  uVar35 = (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  uVar49 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uVar60 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uVar71 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar168 = (uint)(iVar214 < local_248) * local_248 | (uint)(iVar214 >= local_248) * iVar214;
  uVar183 = (uint)(iVar222 < local_248) * local_248 | (uint)(iVar222 >= local_248) * iVar222;
  uVar187 = (uint)(iVar224 < local_248) * local_248 | (uint)(iVar224 >= local_248) * iVar224;
  uVar191 = (uint)(iVar226 < local_248) * local_248 | (uint)(iVar226 >= local_248) * iVar226;
  auVar217._0_4_ =
       (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  auVar217._4_4_ =
       (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  auVar217._8_4_ =
       (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  auVar217._12_4_ =
       (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar168 = (uint)(iVar14 < local_248) * local_248 | (uint)(iVar14 >= local_248) * iVar14;
  uVar183 = (uint)(iVar192 < local_248) * local_248 | (uint)(iVar192 >= local_248) * iVar192;
  uVar187 = (uint)(iVar200 < local_248) * local_248 | (uint)(iVar200 >= local_248) * iVar200;
  uVar191 = (uint)(iVar205 < local_248) * local_248 | (uint)(iVar205 >= local_248) * iVar205;
  uVar36 = (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  uVar50 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uVar61 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uVar72 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar168 = (uint)(iVar245 < local_248) * local_248 | (uint)(iVar245 >= local_248) * iVar245;
  uVar183 = (uint)(iVar253 < local_248) * local_248 | (uint)(iVar253 >= local_248) * iVar253;
  uVar187 = (uint)(iVar254 < local_248) * local_248 | (uint)(iVar254 >= local_248) * iVar254;
  uVar191 = (uint)(iVar255 < local_248) * local_248 | (uint)(iVar255 >= local_248) * iVar255;
  auVar247._0_4_ =
       (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  auVar247._4_4_ =
       (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  auVar247._8_4_ =
       (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  auVar247._12_4_ =
       (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar168 = (uint)(iVar124 < local_248) * local_248 | (uint)(iVar124 >= local_248) * iVar124;
  uVar183 = (uint)(iVar134 < local_248) * local_248 | (uint)(iVar134 >= local_248) * iVar134;
  uVar187 = (uint)(iVar137 < local_248) * local_248 | (uint)(iVar137 >= local_248) * iVar137;
  uVar191 = (uint)(iVar140 < local_248) * local_248 | (uint)(iVar140 >= local_248) * iVar140;
  uVar37 = (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  uVar51 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uVar62 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uVar73 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar168 = (uint)(iVar228 < local_248) * local_248 | (uint)(iVar228 >= local_248) * iVar228;
  uVar183 = (uint)(iVar237 < local_248) * local_248 | (uint)(iVar237 >= local_248) * iVar237;
  uVar187 = (uint)(iVar238 < local_248) * local_248 | (uint)(iVar238 >= local_248) * iVar238;
  uVar191 = (uint)(iVar239 < local_248) * local_248 | (uint)(iVar239 >= local_248) * iVar239;
  auVar230._0_4_ =
       (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  auVar230._4_4_ =
       (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  auVar230._8_4_ =
       (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  auVar230._12_4_ =
       (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar168 = (uint)(iVar210 < local_248) * local_248 | (uint)(iVar210 >= local_248) * iVar210;
  uVar183 = (uint)(iVar283 < local_248) * local_248 | (uint)(iVar283 >= local_248) * iVar283;
  uVar187 = (uint)(iVar57 < local_248) * local_248 | (uint)(iVar57 >= local_248) * iVar57;
  uVar191 = (uint)(iVar68 < local_248) * local_248 | (uint)(iVar68 >= local_248) * iVar68;
  uVar38 = (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  uVar52 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uVar63 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uVar74 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar79 = (uint)(iVar9 < local_248) * local_248 | (uint)(iVar9 >= local_248) * iVar9;
  uVar94 = (uint)(iVar181 < local_248) * local_248 | (uint)(iVar181 >= local_248) * iVar181;
  uVar98 = (uint)(iVar185 < local_248) * local_248 | (uint)(iVar185 >= local_248) * iVar185;
  uVar102 = (uint)(iVar189 < local_248) * local_248 | (uint)(iVar189 >= local_248) * iVar189;
  uVar168 = (uint)(iVar101 < local_248) * local_248 | (uint)(iVar101 >= local_248) * iVar101;
  uVar183 = (uint)(iVar47 < local_248) * local_248 | (uint)(iVar47 >= local_248) * iVar47;
  uVar187 = (uint)(iVar58 < local_248) * local_248 | (uint)(iVar58 >= local_248) * iVar58;
  uVar191 = (uint)(iVar69 < local_248) * local_248 | (uint)(iVar69 >= local_248) * iVar69;
  uVar39 = (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  uVar53 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uVar64 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uVar75 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar80 = (uint)(iVar77 < local_248) * local_248 | (uint)(iVar77 >= local_248) * iVar77;
  uVar95 = (uint)(iVar92 < local_248) * local_248 | (uint)(iVar92 >= local_248) * iVar92;
  uVar99 = (uint)(iVar96 < local_248) * local_248 | (uint)(iVar96 >= local_248) * iVar96;
  uVar103 = (uint)(iVar100 < local_248) * local_248 | (uint)(iVar100 >= local_248) * iVar100;
  uVar168 = (uint)(iVar193 < local_248) * local_248 | (uint)(iVar193 >= local_248) * iVar193;
  uVar183 = (uint)(iVar201 < local_248) * local_248 | (uint)(iVar201 >= local_248) * iVar201;
  uVar187 = (uint)(iVar206 < local_248) * local_248 | (uint)(iVar206 >= local_248) * iVar206;
  uVar191 = (uint)(iVar211 < local_248) * local_248 | (uint)(iVar211 >= local_248) * iVar211;
  uVar40 = (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  uVar54 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uVar65 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uVar76 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar168 = (uint)(iVar32 < local_248) * local_248 | (uint)(iVar32 >= local_248) * iVar32;
  uVar183 = (uint)(iVar45 < local_248) * local_248 | (uint)(iVar45 >= local_248) * iVar45;
  uVar187 = (uint)(iVar55 < local_248) * local_248 | (uint)(iVar55 >= local_248) * iVar55;
  uVar191 = (uint)(iVar66 < local_248) * local_248 | (uint)(iVar66 >= local_248) * iVar66;
  auVar84._0_4_ =
       (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  auVar84._4_4_ =
       (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  auVar84._8_4_ =
       (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  auVar84._12_4_ =
       (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar168 = (uint)(iVar166 < local_248) * local_248 | (uint)(iVar166 >= local_248) * iVar166;
  uVar183 = (uint)(iVar180 < local_248) * local_248 | (uint)(iVar180 >= local_248) * iVar180;
  uVar187 = (uint)(iVar184 < local_248) * local_248 | (uint)(iVar184 >= local_248) * iVar184;
  uVar191 = (uint)(iVar188 < local_248) * local_248 | (uint)(iVar188 >= local_248) * iVar188;
  uVar194 = (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  uVar202 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uVar207 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uVar212 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  auVar87._12_4_ = uStack_1ec;
  auVar87._0_12_ = *(undefined1 (*) [12])in[4];
  auVar42 = pmulld(auVar87,auVar128);
  auVar150 = pmulld(auVar149,auVar128);
  auVar173 = pmulld(auVar172,auVar151);
  auVar129._4_4_ = iVar10;
  auVar129._0_4_ = iVar10;
  auVar129._8_4_ = iVar10;
  auVar129._12_4_ = iVar10;
  auVar130 = pmulld(auVar129,auVar217);
  auVar199 = pmulld(auVar84,auVar231);
  auVar218 = pmulld(auVar217,auVar231);
  auVar110 = pmulld(auVar87,auVar151);
  auVar85 = pmulld(auVar84,auVar151);
  auVar131._4_4_ = iVar20;
  auVar131._0_4_ = iVar20;
  auVar131._8_4_ = iVar20;
  auVar131._12_4_ = iVar20;
  auVar174._4_4_ = iVar3;
  auVar174._0_4_ = iVar3;
  auVar174._8_4_ = iVar3;
  auVar174._12_4_ = iVar3;
  auVar197 = pmulld(auVar247,auVar174);
  auVar108._4_4_ = (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95
  ;
  auVar108._0_4_ = (uint)(local_258 < (int)uVar80) * local_258 | (local_258 >= (int)uVar80) * uVar80
  ;
  auVar108._8_4_ = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99
  ;
  auVar108._12_4_ =
       (uint)(local_258 < (int)uVar103) * local_258 | (local_258 >= (int)uVar103) * uVar103;
  auVar151 = pmulld(auVar108,auVar131);
  auVar175._4_4_ = iVar22;
  auVar175._0_4_ = iVar22;
  auVar175._8_4_ = iVar22;
  auVar175._12_4_ = iVar22;
  auVar86 = pmulld(auVar108,auVar175);
  auVar248 = pmulld(auVar247,auVar131);
  auVar220._4_4_ = iVar2;
  auVar220._0_4_ = iVar2;
  auVar220._8_4_ = iVar2;
  auVar220._12_4_ = iVar2;
  auVar108 = pmulld(auVar220,auVar230);
  auVar18._4_4_ = (uint)(local_258 < (int)uVar94) * local_258 | (local_258 >= (int)uVar94) * uVar94;
  auVar18._0_4_ = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  auVar18._8_4_ = (uint)(local_258 < (int)uVar98) * local_258 | (local_258 >= (int)uVar98) * uVar98;
  auVar18._12_4_ =
       (uint)(local_258 < (int)uVar102) * local_258 | (local_258 >= (int)uVar102) * uVar102;
  auVar87 = pmulld(auVar18,auVar174);
  iVar123 = auVar42._0_4_ + iVar8 >> auVar286;
  iVar2 = auVar42._4_4_ + iVar8 >> auVar286;
  iVar133 = auVar42._8_4_ + iVar8 >> auVar286;
  iVar279 = auVar42._12_4_ + iVar8 >> auVar286;
  iVar283 = auVar110._0_4_ + iVar8 >> auVar286;
  iVar47 = auVar110._4_4_ + iVar8 >> auVar286;
  iVar57 = auVar110._8_4_ + iVar8 >> auVar286;
  iVar58 = auVar110._12_4_ + iVar8 >> auVar286;
  auVar110 = pmulld((undefined1  [16])in[0xc],auVar174);
  auVar231 = pmulld(auVar230,auVar174);
  auVar42 = pmulld((undefined1  [16])in[0xc],auVar131);
  auVar175 = pmulld(auVar18,auVar131);
  iVar13 = auVar110._0_4_ + iVar8 >> auVar286;
  iVar14 = auVar110._4_4_ + iVar8 >> auVar286;
  iVar124 = auVar110._8_4_ + iVar8 >> auVar286;
  iVar3 = auVar110._12_4_ + iVar8 >> auVar286;
  iVar16 = auVar42._0_4_ + iVar8 >> auVar286;
  iVar20 = auVar42._4_4_ + iVar8 >> auVar286;
  iVar22 = auVar42._8_4_ + iVar8 >> auVar286;
  iVar27 = auVar42._12_4_ + iVar8 >> auVar286;
  iVar192 = iVar13 + iVar283;
  iVar137 = iVar14 + iVar47;
  iVar96 = iVar124 + iVar57;
  iVar66 = iVar3 + iVar58;
  iVar283 = iVar283 - iVar13;
  iVar47 = iVar47 - iVar14;
  iVar57 = iVar57 - iVar124;
  iVar58 = iVar58 - iVar3;
  iVar200 = iVar16 + iVar123;
  iVar185 = iVar20 + iVar2;
  iVar100 = iVar22 + iVar133;
  iVar210 = iVar27 + iVar279;
  iVar123 = iVar123 - iVar16;
  iVar2 = iVar2 - iVar20;
  iVar133 = iVar133 - iVar22;
  iVar279 = iVar279 - iVar27;
  auVar43._4_4_ = iVar203;
  auVar43._0_4_ = iVar203;
  auVar43._8_4_ = iVar203;
  auVar43._12_4_ = iVar203;
  auVar241._4_4_ = iVar6;
  auVar241._0_4_ = iVar6;
  auVar241._8_4_ = iVar6;
  auVar241._12_4_ = iVar6;
  uVar168 = (uint)(iVar12 < local_248) * local_248 | (uint)(iVar12 >= local_248) * iVar12;
  uVar183 = (uint)(iVar19 < local_248) * local_248 | (uint)(iVar19 >= local_248) * iVar19;
  uVar187 = (uint)(iVar21 < local_248) * local_248 | (uint)(iVar21 >= local_248) * iVar21;
  uVar191 = (uint)(iVar26 < local_248) * local_248 | (uint)(iVar26 >= local_248) * iVar26;
  auVar232._0_4_ =
       (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  auVar232._4_4_ =
       (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  auVar232._8_4_ =
       (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  auVar232._12_4_ =
       (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar168 = (uint)(iVar143 < local_248) * local_248 | (uint)(iVar143 >= local_248) * iVar143;
  uVar183 = (uint)(iVar155 < local_248) * local_248 | (uint)(iVar155 >= local_248) * iVar155;
  uVar187 = (uint)(iVar159 < local_248) * local_248 | (uint)(iVar159 >= local_248) * iVar159;
  uVar191 = (uint)(iVar163 < local_248) * local_248 | (uint)(iVar163 >= local_248) * iVar163;
  auVar249._0_4_ =
       (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  auVar249._4_4_ =
       (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  auVar249._8_4_ =
       (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  auVar249._12_4_ =
       (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  auVar42 = pmulld(auVar232,auVar241);
  auVar88 = pmulld(auVar249,auVar43);
  auVar111._4_4_ = iVar208;
  auVar111._0_4_ = iVar208;
  auVar111._8_4_ = iVar208;
  auVar111._12_4_ = iVar208;
  uVar168 = (uint)(iVar142 < local_248) * local_248 | (uint)(iVar142 >= local_248) * iVar142;
  uVar183 = (uint)(iVar154 < local_248) * local_248 | (uint)(iVar154 >= local_248) * iVar154;
  uVar187 = (uint)(iVar158 < local_248) * local_248 | (uint)(iVar158 >= local_248) * iVar158;
  uVar191 = (uint)(iVar162 < local_248) * local_248 | (uint)(iVar162 >= local_248) * iVar162;
  uVar168 = (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  uVar94 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uVar103 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uVar28 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar183 = (uint)(iVar15 < local_248) * local_248 | (uint)(iVar15 >= local_248) * iVar15;
  uVar187 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar191 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar79 = (uint)(iVar93 < local_248) * local_248 | (uint)(iVar93 >= local_248) * iVar93;
  uVar183 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uVar95 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uVar23 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar29 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uVar187 = (uint)(iVar257 < local_248) * local_248 | (uint)(iVar257 >= local_248) * iVar257;
  uVar191 = (uint)(iVar266 < local_248) * local_248 | (uint)(iVar266 >= local_248) * iVar266;
  uVar79 = (uint)(iVar269 < local_248) * local_248 | (uint)(iVar269 >= local_248) * iVar269;
  uVar80 = (uint)(iVar272 < local_248) * local_248 | (uint)(iVar272 >= local_248) * iVar272;
  auVar261._0_4_ =
       (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  auVar261._4_4_ =
       (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  auVar261._8_4_ = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79
  ;
  auVar261._12_4_ =
       (uint)(local_258 < (int)uVar80) * local_258 | (local_258 >= (int)uVar80) * uVar80;
  uVar187 = (uint)(iVar105 < local_248) * local_248 | (uint)(iVar105 >= local_248) * iVar105;
  uVar191 = (uint)(iVar118 < local_248) * local_248 | (uint)(iVar118 >= local_248) * iVar118;
  uVar79 = (uint)(iVar144 < local_248) * local_248 | (uint)(iVar144 >= local_248) * iVar144;
  uVar80 = (uint)(iVar160 < local_248) * local_248 | (uint)(iVar160 >= local_248) * iVar160;
  uVar187 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uVar98 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar24 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uVar30 = (uint)(local_258 < (int)uVar80) * local_258 | (local_258 >= (int)uVar80) * uVar80;
  uVar191 = (uint)(iVar33 < local_248) * local_248 | (uint)(iVar33 >= local_248) * iVar33;
  uVar79 = (uint)(iVar56 < local_248) * local_248 | (uint)(iVar56 >= local_248) * iVar56;
  uVar80 = (uint)(iVar78 < local_248) * local_248 | (uint)(iVar78 >= local_248) * iVar78;
  uVar99 = (uint)(iVar97 < local_248) * local_248 | (uint)(iVar97 >= local_248) * iVar97;
  auVar219._0_4_ =
       (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  auVar219._4_4_ = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79
  ;
  auVar219._8_4_ = (uint)(local_258 < (int)uVar80) * local_258 | (local_258 >= (int)uVar80) * uVar80
  ;
  auVar219._12_4_ =
       (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  uVar191 = (uint)(iVar115 < local_248) * local_248 | (uint)(iVar115 >= local_248) * iVar115;
  uVar79 = (uint)(iVar121 < local_248) * local_248 | (uint)(iVar121 >= local_248) * iVar121;
  uVar80 = (uint)(iVar156 < local_248) * local_248 | (uint)(iVar156 >= local_248) * iVar156;
  uVar102 = (uint)(iVar164 < local_248) * local_248 | (uint)(iVar164 >= local_248) * iVar164;
  uVar191 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar99 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uVar25 = (uint)(local_258 < (int)uVar80) * local_258 | (local_258 >= (int)uVar80) * uVar80;
  uVar31 = (uint)(local_258 < (int)uVar102) * local_258 | (local_258 >= (int)uVar102) * uVar102;
  auVar233 = pmulld(auVar232,auVar43);
  auVar18 = pmulld(auVar249,auVar111);
  auVar44._4_4_ = iVar5;
  auVar44._0_4_ = iVar5;
  auVar44._8_4_ = iVar5;
  auVar44._12_4_ = iVar5;
  auVar110 = pmulld(auVar261,auVar44);
  auVar132 = pmulld(auVar219,auVar241);
  auVar262 = pmulld(auVar261,auVar241);
  auVar220 = pmulld(auVar219,auVar43);
  iVar97 = uVar35 + uVar34;
  iVar101 = uVar49 + uVar48;
  iVar115 = uVar60 + uVar59;
  iVar154 = uVar71 + uVar70;
  iVar16 = uVar34 - uVar35;
  iVar3 = uVar48 - uVar49;
  iVar134 = uVar59 - uVar60;
  iVar55 = uVar70 - uVar71;
  iVar254 = auVar41._0_4_ + iVar8 + auVar83._0_4_ >> auVar286;
  iVar255 = auVar41._4_4_ + iVar8 + auVar83._4_4_ >> auVar286;
  iVar256 = auVar41._8_4_ + iVar8 + auVar83._8_4_ >> auVar286;
  iVar257 = auVar41._12_4_ + iVar8 + auVar83._12_4_ >> auVar286;
  iVar20 = auVar150._0_4_ + iVar8 + auVar173._0_4_ >> auVar286;
  iVar5 = auVar150._4_4_ + iVar8 + auVar173._4_4_ >> auVar286;
  iVar181 = auVar150._8_4_ + iVar8 + auVar173._8_4_ >> auVar286;
  iVar21 = auVar150._12_4_ + iVar8 + auVar173._12_4_ >> auVar286;
  iVar27 = auVar199._0_4_ + iVar8 + auVar130._0_4_ >> auVar286;
  iVar203 = auVar199._4_4_ + iVar8 + auVar130._4_4_ >> auVar286;
  iVar208 = auVar199._8_4_ + iVar8 + auVar130._8_4_ >> auVar286;
  iVar13 = auVar199._12_4_ + iVar8 + auVar130._12_4_ >> auVar286;
  iVar143 = auVar85._0_4_ + iVar8 + auVar218._0_4_ >> auVar286;
  iVar136 = auVar85._4_4_ + iVar8 + auVar218._4_4_ >> auVar286;
  iVar281 = auVar85._8_4_ + iVar8 + auVar218._8_4_ >> auVar286;
  iVar140 = auVar85._12_4_ + iVar8 + auVar218._12_4_ >> auVar286;
  iVar22 = iVar27 + iVar254;
  iVar6 = iVar203 + iVar255;
  iVar92 = iVar208 + iVar256;
  iVar67 = iVar13 + iVar257;
  iVar254 = iVar254 - iVar27;
  iVar255 = iVar255 - iVar203;
  iVar256 = iVar256 - iVar208;
  iVar257 = iVar257 - iVar13;
  iVar156 = uVar36 + uVar37;
  iVar160 = uVar50 + uVar51;
  iVar201 = uVar61 + uVar62;
  iVar211 = uVar72 + uVar73;
  iVar27 = uVar37 - uVar36;
  iVar9 = uVar51 - uVar50;
  iVar45 = uVar62 - uVar61;
  iVar78 = uVar73 - uVar72;
  iVar203 = auVar151._0_4_ + iVar8 + auVar197._0_4_ >> auVar286;
  iVar13 = auVar151._4_4_ + iVar8 + auVar197._4_4_ >> auVar286;
  iVar14 = auVar151._8_4_ + iVar8 + auVar197._8_4_ >> auVar286;
  iVar124 = auVar151._12_4_ + iVar8 + auVar197._12_4_ >> auVar286;
  iVar15 = auVar86._0_4_ + iVar8 + auVar248._0_4_ >> auVar286;
  iVar12 = auVar86._4_4_ + iVar8 + auVar248._4_4_ >> auVar286;
  iVar32 = auVar86._8_4_ + iVar8 + auVar248._8_4_ >> auVar286;
  iVar33 = auVar86._12_4_ + iVar8 + auVar248._12_4_ >> auVar286;
  iVar208 = auVar87._0_4_ + iVar8 + auVar108._0_4_ >> auVar286;
  iVar10 = auVar87._4_4_ + iVar8 + auVar108._4_4_ >> auVar286;
  iVar19 = auVar87._8_4_ + iVar8 + auVar108._8_4_ >> auVar286;
  iVar159 = auVar87._12_4_ + iVar8 + auVar108._12_4_ >> auVar286;
  iVar265 = auVar175._0_4_ + iVar8 + auVar231._0_4_ >> auVar286;
  iVar268 = auVar175._4_4_ + iVar8 + auVar231._4_4_ >> auVar286;
  iVar271 = auVar175._8_4_ + iVar8 + auVar231._8_4_ >> auVar286;
  iVar274 = auVar175._12_4_ + iVar8 + auVar231._12_4_ >> auVar286;
  iVar68 = iVar208 + iVar203;
  iVar164 = iVar10 + iVar13;
  iVar114 = iVar19 + iVar14;
  iVar120 = iVar159 + iVar124;
  iVar208 = iVar208 - iVar203;
  iVar10 = iVar10 - iVar13;
  iVar19 = iVar19 - iVar14;
  iVar159 = iVar159 - iVar124;
  iVar224 = uVar39 + uVar38;
  iVar228 = uVar53 + uVar52;
  iVar238 = uVar64 + uVar63;
  iVar245 = uVar75 + uVar74;
  iVar203 = uVar38 - uVar39;
  iVar11 = uVar52 - uVar53;
  iVar46 = uVar63 - uVar64;
  iVar139 = uVar74 - uVar75;
  iVar13 = iVar265 + iVar15;
  iVar77 = iVar268 + iVar12;
  iVar56 = iVar271 + iVar32;
  iVar282 = iVar274 + iVar33;
  iVar265 = iVar265 - iVar15;
  iVar268 = iVar268 - iVar12;
  iVar271 = iVar271 - iVar32;
  iVar274 = iVar274 - iVar33;
  iVar69 = uVar40 + uVar194;
  iVar193 = uVar54 + uVar202;
  iVar206 = uVar65 + uVar207;
  iVar166 = uVar76 + uVar212;
  iVar14 = uVar194 - uVar40;
  iVar32 = uVar202 - uVar54;
  iVar155 = uVar207 - uVar65;
  iVar205 = uVar212 - uVar76;
  auVar173._4_4_ = iVar17;
  auVar173._0_4_ = iVar17;
  auVar173._8_4_ = iVar17;
  auVar173._12_4_ = iVar17;
  auVar85._12_4_ = uStack_22c;
  auVar85._0_12_ = *(undefined1 (*) [12])*in;
  auVar108 = pmulld(auVar85,auVar173);
  iVar226 = auVar108._0_4_ + iVar8 >> auVar286;
  iVar237 = auVar108._4_4_ + iVar8 >> auVar286;
  iVar239 = auVar108._8_4_ + iVar8 >> auVar286;
  iVar253 = auVar108._12_4_ + iVar8 >> auVar286;
  auVar86._12_4_ = uStack_20c;
  auVar86._0_12_ = *(undefined1 (*) [12])in[8];
  auVar108 = pmulld(auVar86,auVar111);
  iVar180 = auVar108._0_4_ + iVar8 >> auVar286;
  iVar182 = auVar108._4_4_ + iVar8 >> auVar286;
  iVar184 = auVar108._8_4_ + iVar8 >> auVar286;
  iVar186 = auVar108._12_4_ + iVar8 >> auVar286;
  iVar266 = iVar143 + iVar20;
  iVar269 = iVar136 + iVar5;
  iVar272 = iVar281 + iVar181;
  iVar276 = iVar140 + iVar21;
  iVar20 = iVar20 - iVar143;
  iVar5 = iVar5 - iVar136;
  iVar181 = iVar181 - iVar281;
  iVar21 = iVar21 - iVar140;
  auVar108 = pmulld(auVar86,auVar43);
  iVar15 = auVar108._0_4_ + iVar8 >> auVar286;
  iVar12 = auVar108._4_4_ + iVar8 >> auVar286;
  iVar26 = auVar108._8_4_ + iVar8 >> auVar286;
  iVar93 = auVar108._12_4_ + iVar8 >> auVar286;
  iVar17 = iVar226 - iVar180;
  iVar33 = iVar237 - iVar182;
  iVar136 = iVar239 - iVar184;
  iVar140 = iVar253 - iVar186;
  iVar180 = iVar180 + iVar226;
  iVar182 = iVar182 + iVar237;
  iVar184 = iVar184 + iVar239;
  iVar186 = iVar186 + iVar253;
  iVar124 = iVar15 + iVar226;
  iVar143 = iVar12 + iVar237;
  iVar281 = iVar26 + iVar239;
  iVar189 = iVar93 + iVar253;
  iVar226 = iVar226 - iVar15;
  iVar237 = iVar237 - iVar12;
  iVar239 = iVar239 - iVar26;
  iVar253 = iVar253 - iVar93;
  auVar112._4_4_ = iVar4;
  auVar112._0_4_ = iVar4;
  auVar112._8_4_ = iVar4;
  auVar112._12_4_ = iVar4;
  uVar79 = (uint)(iVar192 < local_248) * local_248 | (uint)(iVar192 >= local_248) * iVar192;
  uVar80 = (uint)(iVar137 < local_248) * local_248 | (uint)(iVar137 >= local_248) * iVar137;
  uVar34 = (uint)(iVar96 < local_248) * local_248 | (uint)(iVar96 >= local_248) * iVar96;
  uVar36 = (uint)(iVar66 < local_248) * local_248 | (uint)(iVar66 >= local_248) * iVar66;
  uVar79 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uVar102 = (uint)(local_258 < (int)uVar80) * local_258 | (local_258 >= (int)uVar80) * uVar80;
  uVar35 = (uint)(local_258 < (int)uVar34) * local_258 | (local_258 >= (int)uVar34) * uVar34;
  uVar37 = (uint)(local_258 < (int)uVar36) * local_258 | (local_258 >= (int)uVar36) * uVar36;
  uVar80 = (uint)(iVar283 < local_248) * local_248 | (uint)(iVar283 >= local_248) * iVar283;
  uVar34 = (uint)(iVar47 < local_248) * local_248 | (uint)(iVar47 >= local_248) * iVar47;
  uVar36 = (uint)(iVar57 < local_248) * local_248 | (uint)(iVar57 >= local_248) * iVar57;
  uVar38 = (uint)(iVar58 < local_248) * local_248 | (uint)(iVar58 >= local_248) * iVar58;
  auVar176._0_4_ = (uint)(local_258 < (int)uVar80) * local_258 | (local_258 >= (int)uVar80) * uVar80
  ;
  auVar176._4_4_ = (uint)(local_258 < (int)uVar34) * local_258 | (local_258 >= (int)uVar34) * uVar34
  ;
  auVar176._8_4_ = (uint)(local_258 < (int)uVar36) * local_258 | (local_258 >= (int)uVar36) * uVar36
  ;
  auVar176._12_4_ =
       (uint)(local_258 < (int)uVar38) * local_258 | (local_258 >= (int)uVar38) * uVar38;
  uVar80 = (uint)(iVar200 < local_248) * local_248 | (uint)(iVar200 >= local_248) * iVar200;
  uVar34 = (uint)(iVar185 < local_248) * local_248 | (uint)(iVar185 >= local_248) * iVar185;
  uVar36 = (uint)(iVar100 < local_248) * local_248 | (uint)(iVar100 >= local_248) * iVar100;
  uVar38 = (uint)(iVar210 < local_248) * local_248 | (uint)(iVar210 >= local_248) * iVar210;
  uVar80 = (uint)(local_258 < (int)uVar80) * local_258 | (local_258 >= (int)uVar80) * uVar80;
  uVar34 = (uint)(local_258 < (int)uVar34) * local_258 | (local_258 >= (int)uVar34) * uVar34;
  uVar36 = (uint)(local_258 < (int)uVar36) * local_258 | (local_258 >= (int)uVar36) * uVar36;
  uVar38 = (uint)(local_258 < (int)uVar38) * local_258 | (local_258 >= (int)uVar38) * uVar38;
  uVar39 = (uint)(iVar123 < local_248) * local_248 | (uint)(iVar123 >= local_248) * iVar123;
  uVar40 = (uint)(iVar2 < local_248) * local_248 | (uint)(iVar2 >= local_248) * iVar2;
  uVar48 = (uint)(iVar133 < local_248) * local_248 | (uint)(iVar133 >= local_248) * iVar133;
  uVar49 = (uint)(iVar279 < local_248) * local_248 | (uint)(iVar279 >= local_248) * iVar279;
  auVar89._0_4_ = (uint)(local_258 < (int)uVar39) * local_258 | (local_258 >= (int)uVar39) * uVar39;
  auVar89._4_4_ = (uint)(local_258 < (int)uVar40) * local_258 | (local_258 >= (int)uVar40) * uVar40;
  auVar89._8_4_ = (uint)(local_258 < (int)uVar48) * local_258 | (local_258 >= (int)uVar48) * uVar48;
  auVar89._12_4_ = (uint)(local_258 < (int)uVar49) * local_258 | (local_258 >= (int)uVar49) * uVar49
  ;
  auVar41 = pmulld(auVar176,auVar112);
  auVar231 = pmulld(auVar89,auVar173);
  iVar15 = auVar88._0_4_ + iVar8 + auVar42._0_4_ >> auVar286;
  iVar133 = auVar88._4_4_ + iVar8 + auVar42._4_4_ >> auVar286;
  iVar137 = auVar88._8_4_ + iVar8 + auVar42._8_4_ >> auVar286;
  iVar66 = auVar88._12_4_ + iVar8 + auVar42._12_4_ >> auVar286;
  iVar2 = auVar18._0_4_ + iVar8 + auVar233._0_4_ >> auVar286;
  iVar192 = auVar18._4_4_ + iVar8 + auVar233._4_4_ >> auVar286;
  iVar96 = auVar18._8_4_ + iVar8 + auVar233._8_4_ >> auVar286;
  iVar93 = auVar18._12_4_ + iVar8 + auVar233._12_4_ >> auVar286;
  iVar162 = uVar183 + uVar168;
  iVar104 = uVar95 + uVar94;
  iVar117 = uVar23 + uVar103;
  iVar167 = uVar29 + uVar28;
  iVar123 = uVar168 - uVar183;
  iVar4 = uVar94 - uVar95;
  iVar200 = uVar103 - uVar23;
  iVar100 = uVar28 - uVar29;
  iVar12 = auVar132._0_4_ + iVar8 + auVar110._0_4_ >> auVar286;
  iVar279 = auVar132._4_4_ + iVar8 + auVar110._4_4_ >> auVar286;
  iVar185 = auVar132._8_4_ + iVar8 + auVar110._8_4_ >> auVar286;
  iVar26 = auVar132._12_4_ + iVar8 + auVar110._12_4_ >> auVar286;
  iVar188 = auVar220._0_4_ + iVar8 + auVar262._0_4_ >> auVar286;
  iVar190 = auVar220._4_4_ + iVar8 + auVar262._4_4_ >> auVar286;
  iVar214 = auVar220._8_4_ + iVar8 + auVar262._8_4_ >> auVar286;
  iVar222 = auVar220._12_4_ + iVar8 + auVar262._12_4_ >> auVar286;
  iVar163 = iVar12 + iVar15;
  iVar142 = iVar279 + iVar133;
  iVar283 = iVar185 + iVar137;
  iVar118 = iVar26 + iVar66;
  iVar15 = iVar15 - iVar12;
  iVar133 = iVar133 - iVar279;
  iVar137 = iVar137 - iVar185;
  iVar66 = iVar66 - iVar26;
  iVar57 = uVar187 + uVar191;
  iVar58 = uVar98 + uVar99;
  iVar158 = uVar24 + uVar25;
  iVar144 = uVar30 + uVar31;
  iVar12 = uVar191 - uVar187;
  iVar279 = uVar99 - uVar98;
  iVar185 = uVar25 - uVar24;
  iVar26 = uVar31 - uVar30;
  iVar210 = iVar188 + iVar2;
  iVar105 = iVar190 + iVar192;
  iVar47 = iVar214 + iVar96;
  iVar121 = iVar222 + iVar93;
  iVar2 = iVar2 - iVar188;
  iVar192 = iVar192 - iVar190;
  iVar96 = iVar96 - iVar214;
  iVar93 = iVar93 - iVar222;
  uVar168 = (uint)(iVar254 < local_248) * local_248 | (uint)(iVar254 >= local_248) * iVar254;
  uVar183 = (uint)(iVar255 < local_248) * local_248 | (uint)(iVar255 >= local_248) * iVar255;
  uVar187 = (uint)(iVar256 < local_248) * local_248 | (uint)(iVar256 >= local_248) * iVar256;
  uVar191 = (uint)(iVar257 < local_248) * local_248 | (uint)(iVar257 >= local_248) * iVar257;
  auVar263._0_4_ =
       (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  auVar263._4_4_ =
       (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  auVar263._8_4_ =
       (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  auVar263._12_4_ =
       (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar168 = (uint)(iVar20 < local_248) * local_248 | (uint)(iVar20 >= local_248) * iVar20;
  uVar183 = (uint)(iVar5 < local_248) * local_248 | (uint)(iVar5 >= local_248) * iVar5;
  uVar187 = (uint)(iVar181 < local_248) * local_248 | (uint)(iVar181 >= local_248) * iVar181;
  uVar191 = (uint)(iVar21 < local_248) * local_248 | (uint)(iVar21 >= local_248) * iVar21;
  auVar113._0_4_ =
       (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  auVar113._4_4_ =
       (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  auVar113._8_4_ =
       (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  auVar113._12_4_ =
       (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  auVar18 = pmulld(auVar263,auVar241);
  auVar85 = pmulld(auVar113,auVar43);
  uVar168 = (uint)(iVar97 < local_248) * local_248 | (uint)(iVar97 >= local_248) * iVar97;
  uVar183 = (uint)(iVar101 < local_248) * local_248 | (uint)(iVar101 >= local_248) * iVar101;
  uVar187 = (uint)(iVar115 < local_248) * local_248 | (uint)(iVar115 >= local_248) * iVar115;
  uVar191 = (uint)(iVar154 < local_248) * local_248 | (uint)(iVar154 >= local_248) * iVar154;
  uVar99 = (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  uVar30 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uVar49 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uVar54 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar168 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar183 = (uint)(iVar3 < local_248) * local_248 | (uint)(iVar3 >= local_248) * iVar3;
  uVar187 = (uint)(iVar134 < local_248) * local_248 | (uint)(iVar134 >= local_248) * iVar134;
  uVar191 = (uint)(iVar55 < local_248) * local_248 | (uint)(iVar55 >= local_248) * iVar55;
  auVar152._0_4_ =
       (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  auVar152._4_4_ =
       (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  auVar152._8_4_ =
       (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  auVar152._12_4_ =
       (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar168 = (uint)(iVar22 < local_248) * local_248 | (uint)(iVar22 >= local_248) * iVar22;
  uVar183 = (uint)(iVar6 < local_248) * local_248 | (uint)(iVar6 >= local_248) * iVar6;
  uVar187 = (uint)(iVar92 < local_248) * local_248 | (uint)(iVar92 >= local_248) * iVar92;
  uVar191 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar23 = (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  uVar31 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uVar50 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uVar59 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar168 = (uint)(iVar156 < local_248) * local_248 | (uint)(iVar156 >= local_248) * iVar156;
  uVar183 = (uint)(iVar160 < local_248) * local_248 | (uint)(iVar160 >= local_248) * iVar160;
  uVar187 = (uint)(iVar201 < local_248) * local_248 | (uint)(iVar201 >= local_248) * iVar201;
  uVar191 = (uint)(iVar211 < local_248) * local_248 | (uint)(iVar211 >= local_248) * iVar211;
  uVar24 = (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  uVar39 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uVar51 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uVar60 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar168 = (uint)(iVar27 < local_248) * local_248 | (uint)(iVar27 >= local_248) * iVar27;
  uVar183 = (uint)(iVar9 < local_248) * local_248 | (uint)(iVar9 >= local_248) * iVar9;
  uVar187 = (uint)(iVar45 < local_248) * local_248 | (uint)(iVar45 >= local_248) * iVar45;
  uVar191 = (uint)(iVar78 < local_248) * local_248 | (uint)(iVar78 >= local_248) * iVar78;
  auVar264._0_4_ =
       (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  auVar264._4_4_ =
       (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  auVar264._8_4_ =
       (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  auVar264._12_4_ =
       (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar168 = (uint)(iVar68 < local_248) * local_248 | (uint)(iVar68 >= local_248) * iVar68;
  uVar183 = (uint)(iVar164 < local_248) * local_248 | (uint)(iVar164 >= local_248) * iVar164;
  uVar187 = (uint)(iVar114 < local_248) * local_248 | (uint)(iVar114 >= local_248) * iVar114;
  uVar191 = (uint)(iVar120 < local_248) * local_248 | (uint)(iVar120 >= local_248) * iVar120;
  uVar63 = (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  uVar70 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uVar73 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uVar194 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar168 = (uint)(iVar208 < local_248) * local_248 | (uint)(iVar208 >= local_248) * iVar208;
  uVar187 = (uint)(iVar10 < local_248) * local_248 | (uint)(iVar10 >= local_248) * iVar10;
  uVar94 = (uint)(iVar19 < local_248) * local_248 | (uint)(iVar19 >= local_248) * iVar19;
  uVar98 = (uint)(iVar159 < local_248) * local_248 | (uint)(iVar159 >= local_248) * iVar159;
  uVar183 = (uint)(iVar224 < local_248) * local_248 | (uint)(iVar224 >= local_248) * iVar224;
  uVar191 = (uint)(iVar228 < local_248) * local_248 | (uint)(iVar228 >= local_248) * iVar228;
  uVar95 = (uint)(iVar238 < local_248) * local_248 | (uint)(iVar238 >= local_248) * iVar238;
  uVar103 = (uint)(iVar245 < local_248) * local_248 | (uint)(iVar245 >= local_248) * iVar245;
  uVar28 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uVar40 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar52 = (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95;
  uVar61 = (uint)(local_258 < (int)uVar103) * local_258 | (local_258 >= (int)uVar103) * uVar103;
  uVar183 = (uint)(iVar203 < local_248) * local_248 | (uint)(iVar203 >= local_248) * iVar203;
  uVar191 = (uint)(iVar11 < local_248) * local_248 | (uint)(iVar11 >= local_248) * iVar11;
  uVar95 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar103 = (uint)(iVar139 < local_248) * local_248 | (uint)(iVar139 >= local_248) * iVar139;
  auVar90._0_4_ =
       (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  auVar90._4_4_ =
       (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  auVar90._8_4_ = (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95;
  auVar90._12_4_ =
       (uint)(local_258 < (int)uVar103) * local_258 | (local_258 >= (int)uVar103) * uVar103;
  uVar183 = (uint)(iVar13 < local_248) * local_248 | (uint)(iVar13 >= local_248) * iVar13;
  uVar191 = (uint)(iVar77 < local_248) * local_248 | (uint)(iVar77 >= local_248) * iVar77;
  uVar95 = (uint)(iVar56 < local_248) * local_248 | (uint)(iVar56 >= local_248) * iVar56;
  uVar103 = (uint)(iVar282 < local_248) * local_248 | (uint)(iVar282 >= local_248) * iVar282;
  uVar29 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uVar48 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar53 = (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95;
  uVar62 = (uint)(local_258 < (int)uVar103) * local_258 | (local_258 >= (int)uVar103) * uVar103;
  uVar183 = (uint)(iVar265 < local_248) * local_248 | (uint)(iVar265 >= local_248) * iVar265;
  uVar191 = (uint)(iVar268 < local_248) * local_248 | (uint)(iVar268 >= local_248) * iVar268;
  uVar95 = (uint)(iVar271 < local_248) * local_248 | (uint)(iVar271 >= local_248) * iVar271;
  uVar103 = (uint)(iVar274 < local_248) * local_248 | (uint)(iVar274 >= local_248) * iVar274;
  auVar221._0_4_ =
       (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  auVar221._4_4_ =
       (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  auVar221._8_4_ = (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95
  ;
  auVar221._12_4_ =
       (uint)(local_258 < (int)uVar103) * local_258 | (local_258 >= (int)uVar103) * uVar103;
  uVar183 = (uint)(iVar69 < local_248) * local_248 | (uint)(iVar69 >= local_248) * iVar69;
  uVar191 = (uint)(iVar193 < local_248) * local_248 | (uint)(iVar193 >= local_248) * iVar193;
  uVar95 = (uint)(iVar206 < local_248) * local_248 | (uint)(iVar206 >= local_248) * iVar206;
  uVar103 = (uint)(iVar166 < local_248) * local_248 | (uint)(iVar166 >= local_248) * iVar166;
  uVar64 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uVar71 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar74 = (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95;
  uVar202 = (uint)(local_258 < (int)uVar103) * local_258 | (local_258 >= (int)uVar103) * uVar103;
  uVar183 = (uint)(iVar14 < local_248) * local_248 | (uint)(iVar14 >= local_248) * iVar14;
  uVar191 = (uint)(iVar32 < local_248) * local_248 | (uint)(iVar32 >= local_248) * iVar32;
  uVar95 = (uint)(iVar155 < local_248) * local_248 | (uint)(iVar155 >= local_248) * iVar155;
  uVar103 = (uint)(iVar205 < local_248) * local_248 | (uint)(iVar205 >= local_248) * iVar205;
  auVar177._0_4_ =
       (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  auVar177._4_4_ =
       (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  auVar177._8_4_ = (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95
  ;
  auVar177._12_4_ =
       (uint)(local_258 < (int)uVar103) * local_258 | (local_258 >= (int)uVar103) * uVar103;
  uVar183 = (uint)(iVar266 < local_248) * local_248 | (uint)(iVar266 >= local_248) * iVar266;
  uVar191 = (uint)(iVar269 < local_248) * local_248 | (uint)(iVar269 >= local_248) * iVar269;
  uVar95 = (uint)(iVar272 < local_248) * local_248 | (uint)(iVar272 >= local_248) * iVar272;
  uVar103 = (uint)(iVar276 < local_248) * local_248 | (uint)(iVar276 >= local_248) * iVar276;
  uVar284 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uVar287 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar289 = (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95;
  uVar291 = (uint)(local_258 < (int)uVar103) * local_258 | (local_258 >= (int)uVar103) * uVar103;
  auVar86 = pmulld(auVar263,auVar43);
  auVar132 = pmulld(auVar113,auVar111);
  auVar87 = pmulld(auVar152,auVar241);
  auVar150 = pmulld(auVar177,auVar43);
  auVar220 = pmulld(auVar177,auVar111);
  auVar175 = pmulld(auVar152,auVar43);
  auVar88 = pmulld(auVar264,auVar44);
  auVar151 = pmulld(auVar90,auVar241);
  auVar248 = pmulld(auVar264,auVar241);
  auVar218 = pmulld(auVar90,auVar43);
  auVar110._4_4_ =
       (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  auVar110._0_4_ =
       (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  auVar110._8_4_ = (uint)(local_258 < (int)uVar94) * local_258 | (local_258 >= (int)uVar94) * uVar94
  ;
  auVar110._12_4_ =
       (uint)(local_258 < (int)uVar98) * local_258 | (local_258 >= (int)uVar98) * uVar98;
  auVar108 = pmulld(auVar44,auVar110);
  auVar130 = pmulld(auVar221,auVar241);
  auVar197 = pmulld(auVar110,auVar241);
  auVar199 = pmulld(auVar221,auVar43);
  uVar168 = (uint)(iVar180 < local_248) * local_248 | (uint)(iVar180 >= local_248) * iVar180;
  uVar183 = (uint)(iVar182 < local_248) * local_248 | (uint)(iVar182 >= local_248) * iVar182;
  uVar187 = (uint)(iVar184 < local_248) * local_248 | (uint)(iVar184 >= local_248) * iVar184;
  uVar191 = (uint)(iVar186 < local_248) * local_248 | (uint)(iVar186 >= local_248) * iVar186;
  uVar168 = (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  uVar183 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uVar187 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uVar191 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  iVar134 = uVar168 + uVar80;
  iVar181 = uVar183 + uVar34;
  iVar92 = uVar187 + uVar36;
  iVar45 = uVar191 + uVar38;
  iVar203 = uVar168 - uVar80;
  iVar208 = uVar183 - uVar34;
  iVar14 = uVar187 - uVar36;
  iVar3 = uVar191 - uVar38;
  uVar168 = (uint)(iVar17 < local_248) * local_248 | (uint)(iVar17 >= local_248) * iVar17;
  uVar183 = (uint)(iVar33 < local_248) * local_248 | (uint)(iVar33 >= local_248) * iVar33;
  uVar187 = (uint)(iVar136 < local_248) * local_248 | (uint)(iVar136 >= local_248) * iVar136;
  uVar191 = (uint)(iVar140 < local_248) * local_248 | (uint)(iVar140 >= local_248) * iVar140;
  uVar168 = (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  uVar183 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uVar187 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uVar191 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar80 = (uint)(iVar124 < local_248) * local_248 | (uint)(iVar124 >= local_248) * iVar124;
  uVar94 = (uint)(iVar143 < local_248) * local_248 | (uint)(iVar143 >= local_248) * iVar143;
  uVar95 = (uint)(iVar281 < local_248) * local_248 | (uint)(iVar281 >= local_248) * iVar281;
  uVar98 = (uint)(iVar189 < local_248) * local_248 | (uint)(iVar189 >= local_248) * iVar189;
  uVar80 = (uint)(local_258 < (int)uVar80) * local_258 | (local_258 >= (int)uVar80) * uVar80;
  uVar94 = (uint)(local_258 < (int)uVar94) * local_258 | (local_258 >= (int)uVar94) * uVar94;
  uVar95 = (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95;
  uVar98 = (uint)(local_258 < (int)uVar98) * local_258 | (local_258 >= (int)uVar98) * uVar98;
  uVar34 = (uint)(iVar226 < local_248) * local_248 | (uint)(iVar226 >= local_248) * iVar226;
  uVar103 = (uint)(iVar237 < local_248) * local_248 | (uint)(iVar237 >= local_248) * iVar237;
  uVar25 = (uint)(iVar239 < local_248) * local_248 | (uint)(iVar239 >= local_248) * iVar239;
  uVar36 = (uint)(iVar253 < local_248) * local_248 | (uint)(iVar253 >= local_248) * iVar253;
  uVar34 = (uint)(local_258 < (int)uVar34) * local_258 | (local_258 >= (int)uVar34) * uVar34;
  uVar103 = (uint)(local_258 < (int)uVar103) * local_258 | (local_258 >= (int)uVar103) * uVar103;
  uVar25 = (uint)(local_258 < (int)uVar25) * local_258 | (local_258 >= (int)uVar25) * uVar25;
  uVar36 = (uint)(local_258 < (int)uVar36) * local_258 | (local_258 >= (int)uVar36) * uVar36;
  auVar83._4_4_ = auVar89._4_4_ + auVar176._4_4_;
  auVar83._0_4_ = auVar89._0_4_ + auVar176._0_4_;
  auVar83._8_4_ = auVar89._8_4_ + auVar176._8_4_;
  auVar83._12_4_ = auVar89._12_4_ + auVar176._12_4_;
  auVar42 = pmulld(auVar83,auVar173);
  iVar16 = auVar42._0_4_ + iVar8 >> auVar286;
  iVar20 = auVar42._4_4_ + iVar8 >> auVar286;
  iVar22 = auVar42._8_4_ + iVar8 >> auVar286;
  iVar27 = auVar42._12_4_ + iVar8 >> auVar286;
  iVar155 = iVar16 + uVar80;
  iVar136 = iVar20 + uVar94;
  iVar281 = iVar22 + uVar95;
  iVar55 = iVar27 + uVar98;
  iVar16 = uVar80 - iVar16;
  iVar20 = uVar94 - iVar20;
  iVar22 = uVar95 - iVar22;
  iVar27 = uVar98 - iVar27;
  iVar143 = auVar231._0_4_ + iVar8 + auVar41._0_4_ >> auVar286;
  iVar19 = auVar231._4_4_ + iVar8 + auVar41._4_4_ >> auVar286;
  iVar46 = auVar231._8_4_ + iVar8 + auVar41._8_4_ >> auVar286;
  iVar56 = auVar231._12_4_ + iVar8 + auVar41._12_4_ >> auVar286;
  iVar21 = iVar143 + uVar34;
  iVar67 = iVar19 + uVar103;
  iVar78 = iVar46 + uVar25;
  iVar159 = iVar56 + uVar36;
  iVar143 = uVar34 - iVar143;
  iVar19 = uVar103 - iVar19;
  iVar46 = uVar25 - iVar46;
  iVar56 = uVar36 - iVar56;
  iVar11 = uVar168 + uVar79;
  iVar77 = uVar183 + uVar102;
  iVar32 = uVar187 + uVar35;
  iVar33 = uVar191 + uVar37;
  iVar17 = uVar168 - uVar79;
  iVar13 = uVar183 - uVar102;
  iVar124 = uVar187 - uVar35;
  iVar5 = uVar191 - uVar37;
  uVar168 = (uint)(iVar162 < local_248) * local_248 | (uint)(iVar162 >= local_248) * iVar162;
  uVar183 = (uint)(iVar104 < local_248) * local_248 | (uint)(iVar104 >= local_248) * iVar104;
  uVar187 = (uint)(iVar117 < local_248) * local_248 | (uint)(iVar117 >= local_248) * iVar117;
  uVar191 = (uint)(iVar167 < local_248) * local_248 | (uint)(iVar167 >= local_248) * iVar167;
  uVar168 = (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  uVar80 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uVar102 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uVar25 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar183 = (uint)(iVar123 < local_248) * local_248 | (uint)(iVar123 >= local_248) * iVar123;
  uVar187 = (uint)(iVar4 < local_248) * local_248 | (uint)(iVar4 >= local_248) * iVar4;
  uVar191 = (uint)(iVar200 < local_248) * local_248 | (uint)(iVar200 >= local_248) * iVar200;
  uVar79 = (uint)(iVar100 < local_248) * local_248 | (uint)(iVar100 >= local_248) * iVar100;
  auVar153._0_4_ =
       (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  auVar153._4_4_ =
       (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  auVar153._8_4_ =
       (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  auVar153._12_4_ =
       (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uVar183 = (uint)(iVar163 < local_248) * local_248 | (uint)(iVar163 >= local_248) * iVar163;
  uVar187 = (uint)(iVar142 < local_248) * local_248 | (uint)(iVar142 >= local_248) * iVar142;
  uVar191 = (uint)(iVar283 < local_248) * local_248 | (uint)(iVar283 >= local_248) * iVar283;
  uVar79 = (uint)(iVar118 < local_248) * local_248 | (uint)(iVar118 >= local_248) * iVar118;
  uVar183 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uVar94 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uVar34 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar35 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uVar187 = (uint)(iVar15 < local_248) * local_248 | (uint)(iVar15 >= local_248) * iVar15;
  uVar191 = (uint)(iVar133 < local_248) * local_248 | (uint)(iVar133 >= local_248) * iVar133;
  uVar79 = (uint)(iVar137 < local_248) * local_248 | (uint)(iVar137 >= local_248) * iVar137;
  uVar95 = (uint)(iVar66 < local_248) * local_248 | (uint)(iVar66 >= local_248) * iVar66;
  auVar233._0_4_ =
       (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  auVar233._4_4_ =
       (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  auVar233._8_4_ = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79
  ;
  auVar233._12_4_ =
       (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95;
  uVar187 = (uint)(iVar57 < local_248) * local_248 | (uint)(iVar57 >= local_248) * iVar57;
  uVar191 = (uint)(iVar58 < local_248) * local_248 | (uint)(iVar58 >= local_248) * iVar58;
  uVar79 = (uint)(iVar158 < local_248) * local_248 | (uint)(iVar158 >= local_248) * iVar158;
  uVar95 = (uint)(iVar144 < local_248) * local_248 | (uint)(iVar144 >= local_248) * iVar144;
  uVar65 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uVar72 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar75 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uVar207 = (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95;
  uVar187 = (uint)(iVar12 < local_248) * local_248 | (uint)(iVar12 >= local_248) * iVar12;
  uVar191 = (uint)(iVar279 < local_248) * local_248 | (uint)(iVar279 >= local_248) * iVar279;
  uVar79 = (uint)(iVar185 < local_248) * local_248 | (uint)(iVar185 >= local_248) * iVar185;
  uVar95 = (uint)(iVar26 < local_248) * local_248 | (uint)(iVar26 >= local_248) * iVar26;
  auVar234._0_4_ =
       (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  auVar234._4_4_ =
       (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  auVar234._8_4_ = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79
  ;
  auVar234._12_4_ =
       (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95;
  uVar187 = (uint)(iVar210 < local_248) * local_248 | (uint)(iVar210 >= local_248) * iVar210;
  uVar191 = (uint)(iVar105 < local_248) * local_248 | (uint)(iVar105 >= local_248) * iVar105;
  uVar79 = (uint)(iVar47 < local_248) * local_248 | (uint)(iVar47 >= local_248) * iVar47;
  uVar98 = (uint)(iVar121 < local_248) * local_248 | (uint)(iVar121 >= local_248) * iVar121;
  uVar187 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uVar95 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar103 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uVar36 = (uint)(local_258 < (int)uVar98) * local_258 | (local_258 >= (int)uVar98) * uVar98;
  uVar191 = (uint)(iVar2 < local_248) * local_248 | (uint)(iVar2 >= local_248) * iVar2;
  uVar79 = (uint)(iVar192 < local_248) * local_248 | (uint)(iVar192 >= local_248) * iVar192;
  uVar98 = (uint)(iVar96 < local_248) * local_248 | (uint)(iVar96 >= local_248) * iVar96;
  uVar37 = (uint)(iVar93 < local_248) * local_248 | (uint)(iVar93 >= local_248) * iVar93;
  auVar250._0_4_ =
       (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  auVar250._4_4_ = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79
  ;
  auVar250._8_4_ = (uint)(local_258 < (int)uVar98) * local_258 | (local_258 >= (int)uVar98) * uVar98
  ;
  auVar250._12_4_ =
       (uint)(local_258 < (int)uVar37) * local_258 | (local_258 >= (int)uVar37) * uVar37;
  auVar251._0_4_ = auVar250._0_4_ + auVar233._0_4_;
  auVar251._4_4_ = auVar250._4_4_ + auVar233._4_4_;
  auVar251._8_4_ = auVar250._8_4_ + auVar233._8_4_;
  auVar251._12_4_ = auVar250._12_4_ + auVar233._12_4_;
  auVar42 = pmulld(auVar233,auVar112);
  auVar41 = pmulld(auVar250,auVar173);
  auVar83 = pmulld(auVar153,auVar112);
  auVar110 = pmulld(auVar234,auVar173);
  iVar4 = uVar24 + uVar99;
  iVar6 = uVar39 + uVar30;
  iVar9 = uVar51 + uVar49;
  iVar10 = uVar60 + uVar54;
  iVar123 = uVar99 - uVar24;
  iVar15 = uVar30 - uVar39;
  iVar12 = uVar49 - uVar51;
  iVar2 = uVar54 - uVar60;
  uVar30 = (uint)(iVar134 < local_248) * local_248 | (uint)(iVar134 >= local_248) * iVar134;
  uVar37 = (uint)(iVar181 < local_248) * local_248 | (uint)(iVar181 >= local_248) * iVar181;
  uVar39 = (uint)(iVar92 < local_248) * local_248 | (uint)(iVar92 >= local_248) * iVar92;
  uVar51 = (uint)(iVar45 < local_248) * local_248 | (uint)(iVar45 >= local_248) * iVar45;
  uVar191 = (uint)(iVar203 < local_248) * local_248 | (uint)(iVar203 >= local_248) * iVar203;
  uVar79 = (uint)(iVar208 < local_248) * local_248 | (uint)(iVar208 >= local_248) * iVar208;
  uVar98 = (uint)(iVar14 < local_248) * local_248 | (uint)(iVar14 >= local_248) * iVar14;
  uVar99 = (uint)(iVar3 < local_248) * local_248 | (uint)(iVar3 >= local_248) * iVar3;
  uVar54 = (uint)(iVar155 < local_248) * local_248 | (uint)(iVar155 >= local_248) * iVar155;
  uVar60 = (uint)(iVar136 < local_248) * local_248 | (uint)(iVar136 >= local_248) * iVar136;
  uVar76 = (uint)(iVar281 < local_248) * local_248 | (uint)(iVar281 >= local_248) * iVar281;
  uVar273 = (uint)(iVar55 < local_248) * local_248 | (uint)(iVar55 >= local_248) * iVar55;
  uVar24 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar38 = (uint)(iVar20 < local_248) * local_248 | (uint)(iVar20 >= local_248) * iVar20;
  uVar49 = (uint)(iVar22 < local_248) * local_248 | (uint)(iVar22 >= local_248) * iVar22;
  uVar212 = (uint)(iVar27 < local_248) * local_248 | (uint)(iVar27 >= local_248) * iVar27;
  uVar285 = (uint)(iVar21 < local_248) * local_248 | (uint)(iVar21 >= local_248) * iVar21;
  uVar288 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar290 = (uint)(iVar78 < local_248) * local_248 | (uint)(iVar78 >= local_248) * iVar78;
  uVar292 = (uint)(iVar159 < local_248) * local_248 | (uint)(iVar159 >= local_248) * iVar159;
  uVar240 = (uint)(iVar143 < local_248) * local_248 | (uint)(iVar143 >= local_248) * iVar143;
  uVar242 = (uint)(iVar19 < local_248) * local_248 | (uint)(iVar19 >= local_248) * iVar19;
  uVar243 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar244 = (uint)(iVar56 < local_248) * local_248 | (uint)(iVar56 >= local_248) * iVar56;
  uVar195 = (uint)(iVar11 < local_248) * local_248 | (uint)(iVar11 >= local_248) * iVar11;
  uVar204 = (uint)(iVar77 < local_248) * local_248 | (uint)(iVar77 >= local_248) * iVar77;
  uVar209 = (uint)(iVar32 < local_248) * local_248 | (uint)(iVar32 >= local_248) * iVar32;
  uVar213 = (uint)(iVar33 < local_248) * local_248 | (uint)(iVar33 >= local_248) * iVar33;
  uVar106 = (uint)(iVar17 < local_248) * local_248 | (uint)(iVar17 >= local_248) * iVar17;
  uVar116 = (uint)(iVar13 < local_248) * local_248 | (uint)(iVar13 >= local_248) * iVar13;
  uVar119 = (uint)(iVar124 < local_248) * local_248 | (uint)(iVar124 >= local_248) * iVar124;
  uVar122 = (uint)(iVar5 < local_248) * local_248 | (uint)(iVar5 >= local_248) * iVar5;
  uVar145 = (uint)(iVar4 < local_248) * local_248 | (uint)(iVar4 >= local_248) * iVar4;
  uVar157 = (uint)(iVar6 < local_248) * local_248 | (uint)(iVar6 >= local_248) * iVar6;
  uVar161 = (uint)(iVar9 < local_248) * local_248 | (uint)(iVar9 >= local_248) * iVar9;
  uVar165 = (uint)(iVar10 < local_248) * local_248 | (uint)(iVar10 >= local_248) * iVar10;
  uVar125 = (uint)(iVar123 < local_248) * local_248 | (uint)(iVar123 >= local_248) * iVar123;
  uVar135 = (uint)(iVar15 < local_248) * local_248 | (uint)(iVar15 >= local_248) * iVar15;
  uVar138 = (uint)(iVar12 < local_248) * local_248 | (uint)(iVar12 >= local_248) * iVar12;
  uVar141 = (uint)(iVar2 < local_248) * local_248 | (uint)(iVar2 >= local_248) * iVar2;
  uVar215 = (uint)(local_258 < (int)uVar30) * local_258 | (local_258 >= (int)uVar30) * uVar30;
  uVar223 = (uint)(local_258 < (int)uVar37) * local_258 | (local_258 >= (int)uVar37) * uVar37;
  uVar225 = (uint)(local_258 < (int)uVar39) * local_258 | (local_258 >= (int)uVar39) * uVar39;
  uVar227 = (uint)(local_258 < (int)uVar51) * local_258 | (local_258 >= (int)uVar51) * uVar51;
  uVar30 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar37 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uVar39 = (uint)(local_258 < (int)uVar98) * local_258 | (local_258 >= (int)uVar98) * uVar98;
  uVar51 = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  uVar258 = (uint)(local_258 < (int)uVar54) * local_258 | (local_258 >= (int)uVar54) * uVar54;
  uVar267 = (uint)(local_258 < (int)uVar60) * local_258 | (local_258 >= (int)uVar60) * uVar60;
  uVar270 = (uint)(local_258 < (int)uVar76) * local_258 | (local_258 >= (int)uVar76) * uVar76;
  uVar273 = (uint)(local_258 < (int)uVar273) * local_258 | (local_258 >= (int)uVar273) * uVar273;
  uVar54 = (uint)(local_258 < (int)uVar24) * local_258 | (local_258 >= (int)uVar24) * uVar24;
  uVar60 = (uint)(local_258 < (int)uVar38) * local_258 | (local_258 >= (int)uVar38) * uVar38;
  uVar76 = (uint)(local_258 < (int)uVar49) * local_258 | (local_258 >= (int)uVar49) * uVar49;
  uVar212 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uVar285 = (uint)(local_258 < (int)uVar285) * local_258 | (local_258 >= (int)uVar285) * uVar285;
  uVar288 = (uint)(local_258 < (int)uVar288) * local_258 | (local_258 >= (int)uVar288) * uVar288;
  uVar290 = (uint)(local_258 < (int)uVar290) * local_258 | (local_258 >= (int)uVar290) * uVar290;
  uVar292 = (uint)(local_258 < (int)uVar292) * local_258 | (local_258 >= (int)uVar292) * uVar292;
  uVar240 = (uint)(local_258 < (int)uVar240) * local_258 | (local_258 >= (int)uVar240) * uVar240;
  uVar242 = (uint)(local_258 < (int)uVar242) * local_258 | (local_258 >= (int)uVar242) * uVar242;
  uVar243 = (uint)(local_258 < (int)uVar243) * local_258 | (local_258 >= (int)uVar243) * uVar243;
  uVar244 = (uint)(local_258 < (int)uVar244) * local_258 | (local_258 >= (int)uVar244) * uVar244;
  uVar195 = (uint)(local_258 < (int)uVar195) * local_258 | (local_258 >= (int)uVar195) * uVar195;
  uVar204 = (uint)(local_258 < (int)uVar204) * local_258 | (local_258 >= (int)uVar204) * uVar204;
  uVar209 = (uint)(local_258 < (int)uVar209) * local_258 | (local_258 >= (int)uVar209) * uVar209;
  uVar213 = (uint)(local_258 < (int)uVar213) * local_258 | (local_258 >= (int)uVar213) * uVar213;
  uVar106 = (uint)(local_258 < (int)uVar106) * local_258 | (local_258 >= (int)uVar106) * uVar106;
  uVar116 = (uint)(local_258 < (int)uVar116) * local_258 | (local_258 >= (int)uVar116) * uVar116;
  uVar119 = (uint)(local_258 < (int)uVar119) * local_258 | (local_258 >= (int)uVar119) * uVar119;
  uVar122 = (uint)(local_258 < (int)uVar122) * local_258 | (local_258 >= (int)uVar122) * uVar122;
  local_138 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  uStack_134 = (uint)(local_258 < (int)uVar157) * local_258 | (local_258 >= (int)uVar157) * uVar157;
  uStack_130 = (uint)(local_258 < (int)uVar161) * local_258 | (local_258 >= (int)uVar161) * uVar161;
  uStack_12c = (uint)(local_258 < (int)uVar165) * local_258 | (local_258 >= (int)uVar165) * uVar165;
  local_418._0_4_ =
       (uint)(local_258 < (int)uVar125) * local_258 | (local_258 >= (int)uVar125) * uVar125;
  local_418._4_4_ =
       (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  local_418._8_4_ =
       (uint)(local_258 < (int)uVar138) * local_258 | (local_258 >= (int)uVar138) * uVar138;
  local_418._12_4_ =
       (uint)(local_258 < (int)uVar141) * local_258 | (local_258 >= (int)uVar141) * uVar141;
  iVar16 = auVar18._0_4_ + iVar8 + auVar85._0_4_ >> auVar286;
  iVar208 = auVar18._4_4_ + iVar8 + auVar85._4_4_ >> auVar286;
  iVar12 = auVar18._8_4_ + iVar8 + auVar85._8_4_ >> auVar286;
  iVar9 = auVar18._12_4_ + iVar8 + auVar85._12_4_ >> auVar286;
  iVar17 = auVar86._0_4_ + iVar8 + auVar132._0_4_ >> auVar286;
  iVar123 = auVar86._4_4_ + iVar8 + auVar132._4_4_ >> auVar286;
  iVar5 = auVar86._8_4_ + iVar8 + auVar132._8_4_ >> auVar286;
  iVar32 = auVar86._12_4_ + iVar8 + auVar132._12_4_ >> auVar286;
  iVar20 = auVar150._0_4_ + iVar8 + auVar87._0_4_ >> auVar286;
  iVar13 = auVar150._4_4_ + iVar8 + auVar87._4_4_ >> auVar286;
  iVar2 = auVar150._8_4_ + iVar8 + auVar87._8_4_ >> auVar286;
  iVar10 = auVar150._12_4_ + iVar8 + auVar87._12_4_ >> auVar286;
  iVar185 = auVar220._0_4_ + iVar8 + auVar175._0_4_ >> auVar286;
  iVar96 = auVar220._4_4_ + iVar8 + auVar175._4_4_ >> auVar286;
  iVar55 = auVar220._8_4_ + iVar8 + auVar175._8_4_ >> auVar286;
  iVar21 = auVar220._12_4_ + iVar8 + auVar175._12_4_ >> auVar286;
  iVar134 = auVar151._0_4_ + iVar8 + auVar88._0_4_ >> auVar286;
  iVar92 = auVar151._4_4_ + iVar8 + auVar88._4_4_ >> auVar286;
  iVar19 = auVar151._8_4_ + iVar8 + auVar88._8_4_ >> auVar286;
  iVar56 = auVar151._12_4_ + iVar8 + auVar88._12_4_ >> auVar286;
  iVar22 = auVar218._0_4_ + iVar8 + auVar248._0_4_ >> auVar286;
  iVar14 = auVar218._4_4_ + iVar8 + auVar248._4_4_ >> auVar286;
  iVar3 = auVar218._8_4_ + iVar8 + auVar248._8_4_ >> auVar286;
  iVar11 = auVar218._12_4_ + iVar8 + auVar248._12_4_ >> auVar286;
  iVar27 = auVar108._0_4_ + iVar8 + auVar130._0_4_ >> auVar286;
  iVar124 = auVar108._4_4_ + iVar8 + auVar130._4_4_ >> auVar286;
  iVar4 = auVar108._8_4_ + iVar8 + auVar130._8_4_ >> auVar286;
  iVar77 = auVar108._12_4_ + iVar8 + auVar130._12_4_ >> auVar286;
  iVar100 = auVar197._0_4_ + iVar8 + auVar199._0_4_ >> auVar286;
  iVar66 = auVar197._4_4_ + iVar8 + auVar199._4_4_ >> auVar286;
  iVar26 = auVar197._8_4_ + iVar8 + auVar199._8_4_ >> auVar286;
  iVar93 = auVar197._12_4_ + iVar8 + auVar199._12_4_ >> auVar286;
  iVar143 = auVar42._0_4_ + iVar8 + auVar41._0_4_ >> auVar286;
  iVar133 = auVar42._4_4_ + iVar8 + auVar41._4_4_ >> auVar286;
  iVar279 = auVar42._8_4_ + iVar8 + auVar41._8_4_ >> auVar286;
  iVar192 = auVar42._12_4_ + iVar8 + auVar41._12_4_ >> auVar286;
  auVar108 = pmulld(auVar251,auVar173);
  iVar181 = auVar108._0_4_ + iVar8 >> auVar286;
  iVar45 = auVar108._4_4_ + iVar8 >> auVar286;
  iVar46 = auVar108._8_4_ + iVar8 >> auVar286;
  iVar155 = auVar108._12_4_ + iVar8 >> auVar286;
  iVar203 = auVar110._0_4_ + iVar8 + auVar83._0_4_ >> auVar286;
  iVar15 = auVar110._4_4_ + iVar8 + auVar83._4_4_ >> auVar286;
  iVar6 = auVar110._8_4_ + iVar8 + auVar83._8_4_ >> auVar286;
  iVar33 = auVar110._12_4_ + iVar8 + auVar83._12_4_ >> auVar286;
  auVar41._4_4_ = auVar234._4_4_ + auVar153._4_4_;
  auVar41._0_4_ = auVar234._0_4_ + auVar153._0_4_;
  auVar41._8_4_ = auVar234._8_4_ + auVar153._8_4_;
  auVar41._12_4_ = auVar234._12_4_ + auVar153._12_4_;
  auVar108 = pmulld(auVar41,auVar173);
  iVar67 = auVar108._0_4_ + iVar8 >> auVar286;
  iVar78 = auVar108._4_4_ + iVar8 >> auVar286;
  iVar159 = auVar108._8_4_ + iVar8 >> auVar286;
  iVar139 = auVar108._12_4_ + iVar8 >> auVar286;
  iVar136 = uVar63 + uVar23;
  iVar281 = uVar70 + uVar31;
  iVar200 = uVar73 + uVar50;
  iVar137 = uVar194 + uVar59;
  iVar282 = uVar23 - uVar63;
  iVar205 = uVar31 - uVar70;
  iVar140 = uVar50 - uVar73;
  iVar189 = uVar59 - uVar194;
  uVar191 = (uint)(iVar136 < local_248) * local_248 | (uint)(iVar136 >= local_248) * iVar136;
  uVar79 = (uint)(iVar281 < local_248) * local_248 | (uint)(iVar281 >= local_248) * iVar281;
  uVar98 = (uint)(iVar200 < local_248) * local_248 | (uint)(iVar200 >= local_248) * iVar200;
  uVar99 = (uint)(iVar137 < local_248) * local_248 | (uint)(iVar137 >= local_248) * iVar137;
  uStack_124 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  local_128 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uStack_120 = (uint)(local_258 < (int)uVar98) * local_258 | (local_258 >= (int)uVar98) * uVar98;
  uStack_11c = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  iVar136 = iVar27 + iVar16;
  iVar281 = iVar124 + iVar208;
  iVar200 = iVar4 + iVar12;
  iVar137 = iVar77 + iVar9;
  iVar16 = iVar16 - iVar27;
  iVar208 = iVar208 - iVar124;
  iVar12 = iVar12 - iVar4;
  iVar9 = iVar9 - iVar77;
  uVar191 = (uint)(iVar282 < local_248) * local_248 | (uint)(iVar282 >= local_248) * iVar282;
  uVar79 = (uint)(iVar205 < local_248) * local_248 | (uint)(iVar205 >= local_248) * iVar205;
  uVar98 = (uint)(iVar140 < local_248) * local_248 | (uint)(iVar140 >= local_248) * iVar140;
  uVar99 = (uint)(iVar189 < local_248) * local_248 | (uint)(iVar189 >= local_248) * iVar189;
  auVar252._0_4_ =
       (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  auVar252._4_4_ = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79
  ;
  auVar252._8_4_ = (uint)(local_258 < (int)uVar98) * local_258 | (local_258 >= (int)uVar98) * uVar98
  ;
  auVar252._12_4_ =
       (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  uVar191 = (uint)(iVar136 < local_248) * local_248 | (uint)(iVar136 >= local_248) * iVar136;
  uVar79 = (uint)(iVar281 < local_248) * local_248 | (uint)(iVar281 >= local_248) * iVar281;
  uVar98 = (uint)(iVar200 < local_248) * local_248 | (uint)(iVar200 >= local_248) * iVar200;
  uVar99 = (uint)(iVar137 < local_248) * local_248 | (uint)(iVar137 >= local_248) * iVar137;
  uStack_114 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  local_118 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uStack_110 = (uint)(local_258 < (int)uVar98) * local_258 | (local_258 >= (int)uVar98) * uVar98;
  uStack_10c = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  iVar27 = iVar134 + iVar20;
  iVar124 = iVar92 + iVar13;
  iVar4 = iVar19 + iVar2;
  iVar77 = iVar56 + iVar10;
  iVar20 = iVar20 - iVar134;
  iVar13 = iVar13 - iVar92;
  iVar2 = iVar2 - iVar19;
  iVar10 = iVar10 - iVar56;
  uVar191 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar79 = (uint)(iVar208 < local_248) * local_248 | (uint)(iVar208 >= local_248) * iVar208;
  uVar98 = (uint)(iVar12 < local_248) * local_248 | (uint)(iVar12 >= local_248) * iVar12;
  uVar99 = (uint)(iVar9 < local_248) * local_248 | (uint)(iVar9 >= local_248) * iVar9;
  uVar31 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar38 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uVar49 = (uint)(local_258 < (int)uVar98) * local_258 | (local_258 >= (int)uVar98) * uVar98;
  uVar50 = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  uVar191 = (uint)(iVar27 < local_248) * local_248 | (uint)(iVar27 >= local_248) * iVar27;
  uVar79 = (uint)(iVar124 < local_248) * local_248 | (uint)(iVar124 >= local_248) * iVar124;
  uVar98 = (uint)(iVar4 < local_248) * local_248 | (uint)(iVar4 >= local_248) * iVar4;
  uVar99 = (uint)(iVar77 < local_248) * local_248 | (uint)(iVar77 >= local_248) * iVar77;
  uStack_104 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  local_108 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uStack_100 = (uint)(local_258 < (int)uVar98) * local_258 | (local_258 >= (int)uVar98) * uVar98;
  uStack_fc = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  iVar12 = uVar28 + uVar64;
  iVar4 = uVar40 + uVar71;
  iVar9 = uVar52 + uVar74;
  iVar77 = uVar61 + uVar202;
  iVar16 = uVar64 - uVar28;
  iVar27 = uVar71 - uVar40;
  iVar208 = uVar74 - uVar52;
  iVar124 = uVar202 - uVar61;
  uVar191 = (uint)(iVar20 < local_248) * local_248 | (uint)(iVar20 >= local_248) * iVar20;
  uVar79 = (uint)(iVar13 < local_248) * local_248 | (uint)(iVar13 >= local_248) * iVar13;
  uVar98 = (uint)(iVar2 < local_248) * local_248 | (uint)(iVar2 >= local_248) * iVar2;
  uVar99 = (uint)(iVar10 < local_248) * local_248 | (uint)(iVar10 >= local_248) * iVar10;
  auVar248._0_4_ =
       (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  auVar248._4_4_ = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79
  ;
  auVar248._8_4_ = (uint)(local_258 < (int)uVar98) * local_258 | (local_258 >= (int)uVar98) * uVar98
  ;
  auVar248._12_4_ =
       (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  uVar191 = (uint)(iVar12 < local_248) * local_248 | (uint)(iVar12 >= local_248) * iVar12;
  uVar79 = (uint)(iVar4 < local_248) * local_248 | (uint)(iVar4 >= local_248) * iVar4;
  uVar98 = (uint)(iVar9 < local_248) * local_248 | (uint)(iVar9 >= local_248) * iVar9;
  uVar99 = (uint)(iVar77 < local_248) * local_248 | (uint)(iVar77 >= local_248) * iVar77;
  local_48 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uStack_44 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uStack_40 = (uint)(local_258 < (int)uVar98) * local_258 | (local_258 >= (int)uVar98) * uVar98;
  uStack_3c = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  iVar20 = uVar29 + uVar284;
  iVar13 = uVar48 + uVar287;
  iVar12 = uVar53 + uVar289;
  iVar2 = uVar62 + uVar291;
  iVar4 = uVar284 - uVar29;
  iVar9 = uVar287 - uVar48;
  iVar10 = uVar289 - uVar53;
  iVar77 = uVar291 - uVar62;
  uVar191 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar79 = (uint)(iVar27 < local_248) * local_248 | (uint)(iVar27 >= local_248) * iVar27;
  uVar99 = (uint)(iVar208 < local_248) * local_248 | (uint)(iVar208 >= local_248) * iVar208;
  uVar24 = (uint)(iVar124 < local_248) * local_248 | (uint)(iVar124 >= local_248) * iVar124;
  uVar191 = (uint)(local_258 < (int)uVar191) * local_258 | (local_258 >= (int)uVar191) * uVar191;
  uVar98 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uVar23 = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  uVar28 = (uint)(local_258 < (int)uVar24) * local_258 | (local_258 >= (int)uVar24) * uVar24;
  uVar79 = (uint)(iVar20 < local_248) * local_248 | (uint)(iVar20 >= local_248) * iVar20;
  uVar99 = (uint)(iVar13 < local_248) * local_248 | (uint)(iVar13 >= local_248) * iVar13;
  uVar24 = (uint)(iVar12 < local_248) * local_248 | (uint)(iVar12 >= local_248) * iVar12;
  uVar29 = (uint)(iVar2 < local_248) * local_248 | (uint)(iVar2 >= local_248) * iVar2;
  uStack_54 = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  local_58 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uStack_50 = (uint)(local_258 < (int)uVar24) * local_258 | (local_258 >= (int)uVar24) * uVar24;
  uStack_4c = (uint)(local_258 < (int)uVar29) * local_258 | (local_258 >= (int)uVar29) * uVar29;
  iVar16 = iVar100 + iVar17;
  iVar20 = iVar66 + iVar123;
  iVar27 = iVar26 + iVar5;
  iVar208 = iVar93 + iVar32;
  iVar17 = iVar17 - iVar100;
  iVar123 = iVar123 - iVar66;
  iVar5 = iVar5 - iVar26;
  iVar32 = iVar32 - iVar93;
  uVar79 = (uint)(iVar4 < local_248) * local_248 | (uint)(iVar4 >= local_248) * iVar4;
  uVar99 = (uint)(iVar9 < local_248) * local_248 | (uint)(iVar9 >= local_248) * iVar9;
  uVar24 = (uint)(iVar10 < local_248) * local_248 | (uint)(iVar10 >= local_248) * iVar10;
  uVar29 = (uint)(iVar77 < local_248) * local_248 | (uint)(iVar77 >= local_248) * iVar77;
  auVar235._0_4_ = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79
  ;
  auVar235._4_4_ = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99
  ;
  auVar235._8_4_ = (uint)(local_258 < (int)uVar24) * local_258 | (local_258 >= (int)uVar24) * uVar24
  ;
  auVar235._12_4_ =
       (uint)(local_258 < (int)uVar29) * local_258 | (local_258 >= (int)uVar29) * uVar29;
  uVar79 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar99 = (uint)(iVar20 < local_248) * local_248 | (uint)(iVar20 >= local_248) * iVar20;
  uVar24 = (uint)(iVar27 < local_248) * local_248 | (uint)(iVar27 >= local_248) * iVar27;
  uVar29 = (uint)(iVar208 < local_248) * local_248 | (uint)(iVar208 >= local_248) * iVar208;
  uStack_64 = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  local_68 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uStack_60 = (uint)(local_258 < (int)uVar24) * local_258 | (local_258 >= (int)uVar24) * uVar24;
  uStack_5c = (uint)(local_258 < (int)uVar29) * local_258 | (local_258 >= (int)uVar29) * uVar29;
  iVar16 = iVar22 + iVar185;
  iVar20 = iVar14 + iVar96;
  iVar27 = iVar3 + iVar55;
  iVar208 = iVar11 + iVar21;
  iVar185 = iVar185 - iVar22;
  iVar96 = iVar96 - iVar14;
  iVar55 = iVar55 - iVar3;
  iVar21 = iVar21 - iVar11;
  uVar79 = (uint)(iVar17 < local_248) * local_248 | (uint)(iVar17 >= local_248) * iVar17;
  uVar99 = (uint)(iVar123 < local_248) * local_248 | (uint)(iVar123 >= local_248) * iVar123;
  uVar24 = (uint)(iVar5 < local_248) * local_248 | (uint)(iVar5 >= local_248) * iVar5;
  uVar29 = (uint)(iVar32 < local_248) * local_248 | (uint)(iVar32 >= local_248) * iVar32;
  local_408._0_4_ =
       (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  local_408._4_4_ =
       (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  local_408._8_4_ =
       (uint)(local_258 < (int)uVar24) * local_258 | (local_258 >= (int)uVar24) * uVar24;
  local_408._12_4_ =
       (uint)(local_258 < (int)uVar29) * local_258 | (local_258 >= (int)uVar29) * uVar29;
  uVar79 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar99 = (uint)(iVar20 < local_248) * local_248 | (uint)(iVar20 >= local_248) * iVar20;
  uVar24 = (uint)(iVar27 < local_248) * local_248 | (uint)(iVar27 >= local_248) * iVar27;
  uVar29 = (uint)(iVar208 < local_248) * local_248 | (uint)(iVar208 >= local_248) * iVar208;
  uStack_74 = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  local_78 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uStack_70 = (uint)(local_258 < (int)uVar24) * local_258 | (local_258 >= (int)uVar24) * uVar24;
  uStack_6c = (uint)(local_258 < (int)uVar29) * local_258 | (local_258 >= (int)uVar29) * uVar29;
  iVar16 = uVar215 + uVar65;
  iVar20 = uVar223 + uVar72;
  iVar22 = uVar225 + uVar75;
  iVar27 = uVar227 + uVar207;
  iVar17 = uVar215 - uVar65;
  iVar208 = uVar223 - uVar72;
  iVar13 = uVar225 - uVar75;
  iVar14 = uVar227 - uVar207;
  uVar79 = (uint)(iVar185 < local_248) * local_248 | (uint)(iVar185 >= local_248) * iVar185;
  uVar99 = (uint)(iVar96 < local_248) * local_248 | (uint)(iVar96 >= local_248) * iVar96;
  uVar24 = (uint)(iVar55 < local_248) * local_248 | (uint)(iVar55 >= local_248) * iVar55;
  uVar29 = (uint)(iVar21 < local_248) * local_248 | (uint)(iVar21 >= local_248) * iVar21;
  auVar178._0_4_ = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79
  ;
  auVar178._4_4_ = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99
  ;
  auVar178._8_4_ = (uint)(local_258 < (int)uVar24) * local_258 | (local_258 >= (int)uVar24) * uVar24
  ;
  auVar178._12_4_ =
       (uint)(local_258 < (int)uVar29) * local_258 | (local_258 >= (int)uVar29) * uVar29;
  uVar79 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar99 = (uint)(iVar20 < local_248) * local_248 | (uint)(iVar20 >= local_248) * iVar20;
  uVar24 = (uint)(iVar22 < local_248) * local_248 | (uint)(iVar22 >= local_248) * iVar22;
  uVar29 = (uint)(iVar27 < local_248) * local_248 | (uint)(iVar27 >= local_248) * iVar27;
  local_238 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uStack_234 = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  uStack_230 = (uint)(local_258 < (int)uVar24) * local_258 | (local_258 >= (int)uVar24) * uVar24;
  uStack_22c = (uint)(local_258 < (int)uVar29) * local_258 | (local_258 >= (int)uVar29) * uVar29;
  uVar79 = (uint)(iVar17 < local_248) * local_248 | (uint)(iVar17 >= local_248) * iVar17;
  uVar99 = (uint)(iVar208 < local_248) * local_248 | (uint)(iVar208 >= local_248) * iVar208;
  uVar24 = (uint)(iVar13 < local_248) * local_248 | (uint)(iVar13 >= local_248) * iVar13;
  uVar29 = (uint)(iVar14 < local_248) * local_248 | (uint)(iVar14 >= local_248) * iVar14;
  local_148 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uStack_144 = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  uStack_140 = (uint)(local_258 < (int)uVar24) * local_258 | (local_258 >= (int)uVar24) * uVar24;
  uStack_13c = (uint)(local_258 < (int)uVar29) * local_258 | (local_258 >= (int)uVar29) * uVar29;
  iVar16 = uVar258 + uVar187;
  iVar20 = uVar267 + uVar95;
  iVar22 = uVar270 + uVar103;
  iVar27 = uVar273 + uVar36;
  iVar17 = uVar258 - uVar187;
  iVar208 = uVar267 - uVar95;
  iVar13 = uVar270 - uVar103;
  iVar14 = uVar273 - uVar36;
  uVar187 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar79 = (uint)(iVar20 < local_248) * local_248 | (uint)(iVar20 >= local_248) * iVar20;
  uVar95 = (uint)(iVar22 < local_248) * local_248 | (uint)(iVar22 >= local_248) * iVar22;
  uVar99 = (uint)(iVar27 < local_248) * local_248 | (uint)(iVar27 >= local_248) * iVar27;
  local_228 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uStack_224 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uStack_220 = (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95;
  uStack_21c = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  uVar187 = (uint)(iVar17 < local_248) * local_248 | (uint)(iVar17 >= local_248) * iVar17;
  uVar79 = (uint)(iVar208 < local_248) * local_248 | (uint)(iVar208 >= local_248) * iVar208;
  uVar95 = (uint)(iVar13 < local_248) * local_248 | (uint)(iVar13 >= local_248) * iVar13;
  uVar99 = (uint)(iVar14 < local_248) * local_248 | (uint)(iVar14 >= local_248) * iVar14;
  uStack_154 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  local_158 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uStack_150 = (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95;
  uStack_14c = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  iVar16 = iVar181 + uVar285;
  iVar20 = iVar45 + uVar288;
  iVar22 = iVar46 + uVar290;
  iVar27 = iVar155 + uVar292;
  iVar181 = uVar285 - iVar181;
  iVar45 = uVar288 - iVar45;
  iVar46 = uVar290 - iVar46;
  iVar155 = uVar292 - iVar155;
  uVar187 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar79 = (uint)(iVar20 < local_248) * local_248 | (uint)(iVar20 >= local_248) * iVar20;
  uVar95 = (uint)(iVar22 < local_248) * local_248 | (uint)(iVar22 >= local_248) * iVar22;
  uVar99 = (uint)(iVar27 < local_248) * local_248 | (uint)(iVar27 >= local_248) * iVar27;
  local_218 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uStack_214 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uStack_210 = (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95;
  uStack_20c = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  uVar187 = (uint)(iVar181 < local_248) * local_248 | (uint)(iVar181 >= local_248) * iVar181;
  uVar79 = (uint)(iVar45 < local_248) * local_248 | (uint)(iVar45 >= local_248) * iVar45;
  uVar95 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar99 = (uint)(iVar155 < local_248) * local_248 | (uint)(iVar155 >= local_248) * iVar155;
  uStack_164 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  local_168 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uStack_160 = (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95;
  uStack_15c = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  iVar16 = iVar67 + uVar195;
  iVar20 = iVar78 + uVar204;
  iVar22 = iVar159 + uVar209;
  iVar27 = iVar139 + uVar213;
  iVar67 = uVar195 - iVar67;
  iVar78 = uVar204 - iVar78;
  iVar159 = uVar209 - iVar159;
  iVar139 = uVar213 - iVar139;
  uVar187 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar79 = (uint)(iVar20 < local_248) * local_248 | (uint)(iVar20 >= local_248) * iVar20;
  uVar95 = (uint)(iVar22 < local_248) * local_248 | (uint)(iVar22 >= local_248) * iVar22;
  uVar99 = (uint)(iVar27 < local_248) * local_248 | (uint)(iVar27 >= local_248) * iVar27;
  local_208 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uStack_204 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uStack_200 = (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95;
  uStack_1fc = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  uVar187 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar79 = (uint)(iVar78 < local_248) * local_248 | (uint)(iVar78 >= local_248) * iVar78;
  uVar95 = (uint)(iVar159 < local_248) * local_248 | (uint)(iVar159 >= local_248) * iVar159;
  uVar99 = (uint)(iVar139 < local_248) * local_248 | (uint)(iVar139 >= local_248) * iVar139;
  uStack_174 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  local_178 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uStack_170 = (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95;
  uStack_16c = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  iVar16 = iVar203 + uVar106;
  iVar20 = iVar15 + uVar116;
  iVar22 = iVar6 + uVar119;
  iVar27 = iVar33 + uVar122;
  iVar203 = uVar106 - iVar203;
  iVar15 = uVar116 - iVar15;
  iVar6 = uVar119 - iVar6;
  iVar33 = uVar122 - iVar33;
  uVar187 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar79 = (uint)(iVar20 < local_248) * local_248 | (uint)(iVar20 >= local_248) * iVar20;
  uVar95 = (uint)(iVar22 < local_248) * local_248 | (uint)(iVar22 >= local_248) * iVar22;
  uVar99 = (uint)(iVar27 < local_248) * local_248 | (uint)(iVar27 >= local_248) * iVar27;
  local_1f8 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uStack_1f4 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uStack_1f0 = (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95;
  uStack_1ec = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  uVar187 = (uint)(iVar203 < local_248) * local_248 | (uint)(iVar203 >= local_248) * iVar203;
  uVar79 = (uint)(iVar15 < local_248) * local_248 | (uint)(iVar15 >= local_248) * iVar15;
  uVar95 = (uint)(iVar6 < local_248) * local_248 | (uint)(iVar6 >= local_248) * iVar6;
  uVar99 = (uint)(iVar33 < local_248) * local_248 | (uint)(iVar33 >= local_248) * iVar33;
  uStack_184 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  local_188 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uStack_180 = (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95;
  uStack_17c = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  iVar16 = iVar143 + uVar240;
  iVar20 = iVar133 + uVar242;
  iVar22 = iVar279 + uVar243;
  iVar27 = iVar192 + uVar244;
  iVar143 = uVar240 - iVar143;
  iVar133 = uVar242 - iVar133;
  iVar279 = uVar243 - iVar279;
  iVar192 = uVar244 - iVar192;
  uVar187 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar79 = (uint)(iVar20 < local_248) * local_248 | (uint)(iVar20 >= local_248) * iVar20;
  uVar95 = (uint)(iVar22 < local_248) * local_248 | (uint)(iVar22 >= local_248) * iVar22;
  uVar99 = (uint)(iVar27 < local_248) * local_248 | (uint)(iVar27 >= local_248) * iVar27;
  uStack_1e4 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  local_1e8 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uStack_1e0 = (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95;
  uStack_1dc = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  uVar187 = (uint)(iVar143 < local_248) * local_248 | (uint)(iVar143 >= local_248) * iVar143;
  uVar79 = (uint)(iVar133 < local_248) * local_248 | (uint)(iVar133 >= local_248) * iVar133;
  uVar95 = (uint)(iVar279 < local_248) * local_248 | (uint)(iVar279 >= local_248) * iVar279;
  uVar99 = (uint)(iVar192 < local_248) * local_248 | (uint)(iVar192 >= local_248) * iVar192;
  uStack_194 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  local_198 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uStack_190 = (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95;
  uStack_18c = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  iVar16 = uVar54 + uVar183;
  iVar20 = uVar60 + uVar94;
  iVar22 = uVar76 + uVar34;
  iVar27 = uVar212 + uVar35;
  iVar17 = uVar54 - uVar183;
  iVar203 = uVar60 - uVar94;
  iVar208 = uVar76 - uVar34;
  iVar13 = uVar212 - uVar35;
  uVar183 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar187 = (uint)(iVar20 < local_248) * local_248 | (uint)(iVar20 >= local_248) * iVar20;
  uVar79 = (uint)(iVar22 < local_248) * local_248 | (uint)(iVar22 >= local_248) * iVar22;
  uVar94 = (uint)(iVar27 < local_248) * local_248 | (uint)(iVar27 >= local_248) * iVar27;
  uStack_1d4 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  local_1d8 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uStack_1d0 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uStack_1cc = (uint)(local_258 < (int)uVar94) * local_258 | (local_258 >= (int)uVar94) * uVar94;
  uVar183 = (uint)(iVar17 < local_248) * local_248 | (uint)(iVar17 >= local_248) * iVar17;
  uVar187 = (uint)(iVar203 < local_248) * local_248 | (uint)(iVar203 >= local_248) * iVar203;
  uVar79 = (uint)(iVar208 < local_248) * local_248 | (uint)(iVar208 >= local_248) * iVar208;
  uVar94 = (uint)(iVar13 < local_248) * local_248 | (uint)(iVar13 >= local_248) * iVar13;
  uStack_1a4 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  local_1a8 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uStack_1a0 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uStack_19c = (uint)(local_258 < (int)uVar94) * local_258 | (local_258 >= (int)uVar94) * uVar94;
  iVar16 = uVar30 + uVar168;
  iVar20 = uVar37 + uVar80;
  iVar22 = uVar39 + uVar102;
  iVar27 = uVar51 + uVar25;
  iVar17 = uVar30 - uVar168;
  iVar203 = uVar37 - uVar80;
  iVar208 = uVar39 - uVar102;
  iVar13 = uVar51 - uVar25;
  uVar168 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar183 = (uint)(iVar20 < local_248) * local_248 | (uint)(iVar20 >= local_248) * iVar20;
  uVar187 = (uint)(iVar22 < local_248) * local_248 | (uint)(iVar22 >= local_248) * iVar22;
  uVar79 = (uint)(iVar27 < local_248) * local_248 | (uint)(iVar27 >= local_248) * iVar27;
  uVar80 = (uint)(iVar17 < local_248) * local_248 | (uint)(iVar17 >= local_248) * iVar17;
  uVar94 = (uint)(iVar203 < local_248) * local_248 | (uint)(iVar203 >= local_248) * iVar203;
  uVar95 = (uint)(iVar208 < local_248) * local_248 | (uint)(iVar208 >= local_248) * iVar208;
  uVar99 = (uint)(iVar13 < local_248) * local_248 | (uint)(iVar13 >= local_248) * iVar13;
  local_1c8 = (uint)(local_258 < (int)uVar168) * local_258 | (local_258 >= (int)uVar168) * uVar168;
  uStack_1c4 = (uint)(local_258 < (int)uVar183) * local_258 | (local_258 >= (int)uVar183) * uVar183;
  uStack_1c0 = (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  uStack_1bc = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  local_1b8 = (uint)(local_258 < (int)uVar80) * local_258 | (local_258 >= (int)uVar80) * uVar80;
  uStack_1b4 = (uint)(local_258 < (int)uVar94) * local_258 | (local_258 >= (int)uVar94) * uVar94;
  uStack_1b0 = (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95;
  uStack_1ac = (uint)(local_258 < (int)uVar99) * local_258 | (local_258 >= (int)uVar99) * uVar99;
  auVar179._0_4_ = auVar178._0_4_ + auVar248._0_4_;
  auVar179._4_4_ = auVar178._4_4_ + auVar248._4_4_;
  auVar179._8_4_ = auVar178._8_4_ + auVar248._8_4_;
  auVar179._12_4_ = auVar178._12_4_ + auVar248._12_4_;
  auVar42 = pmulld(auVar248,auVar112);
  auVar108 = pmulld(auVar178,auVar173);
  auVar197 = pmulld(auVar179,auVar173);
  iStack_84 = auVar197._4_4_ + iVar8 >> auVar286;
  local_88 = auVar197._0_4_ + iVar8 >> auVar286;
  iStack_80 = auVar197._8_4_ + iVar8 >> auVar286;
  iStack_7c = auVar197._12_4_ + iVar8 >> auVar286;
  iStack_f4 = auVar42._4_4_ + iVar8 + auVar108._4_4_ >> auVar286;
  local_f8 = auVar42._0_4_ + iVar8 + auVar108._0_4_ >> auVar286;
  iStack_f0 = auVar42._8_4_ + iVar8 + auVar108._8_4_ >> auVar286;
  iStack_ec = auVar42._12_4_ + iVar8 + auVar108._12_4_ >> auVar286;
  auVar42._4_4_ = uVar38;
  auVar42._0_4_ = uVar31;
  auVar42._8_4_ = uVar49;
  auVar42._12_4_ = uVar50;
  auVar91._0_4_ = local_408._0_4_ + uVar31;
  auVar91._4_4_ = local_408._4_4_ + uVar38;
  auVar91._8_4_ = local_408._8_4_ + uVar49;
  auVar91._12_4_ = local_408._12_4_ + uVar50;
  auVar197 = pmulld(auVar42,auVar112);
  auVar108 = pmulld(local_408,auVar173);
  auVar42 = pmulld(auVar91,auVar173);
  iStack_94 = auVar42._4_4_ + iVar8 >> auVar286;
  local_98 = auVar42._0_4_ + iVar8 >> auVar286;
  iStack_90 = auVar42._8_4_ + iVar8 >> auVar286;
  iStack_8c = auVar42._12_4_ + iVar8 >> auVar286;
  iStack_e4 = auVar197._4_4_ + iVar8 + auVar108._4_4_ >> auVar286;
  local_e8 = auVar197._0_4_ + iVar8 + auVar108._0_4_ >> auVar286;
  iStack_e0 = auVar197._8_4_ + iVar8 + auVar108._8_4_ >> auVar286;
  iStack_dc = auVar197._12_4_ + iVar8 + auVar108._12_4_ >> auVar286;
  auVar236._0_4_ = auVar235._0_4_ + auVar252._0_4_;
  auVar236._4_4_ = auVar235._4_4_ + auVar252._4_4_;
  auVar236._8_4_ = auVar235._8_4_ + auVar252._8_4_;
  auVar236._12_4_ = auVar235._12_4_ + auVar252._12_4_;
  auVar42 = pmulld(auVar252,auVar112);
  auVar108 = pmulld(auVar235,auVar173);
  auVar197 = pmulld(auVar236,auVar173);
  iStack_a4 = auVar197._4_4_ + iVar8 >> auVar286;
  local_a8 = auVar197._0_4_ + iVar8 >> auVar286;
  iStack_a0 = auVar197._8_4_ + iVar8 >> auVar286;
  iStack_9c = auVar197._12_4_ + iVar8 >> auVar286;
  iStack_d4 = auVar42._4_4_ + iVar8 + auVar108._4_4_ >> auVar286;
  local_d8 = auVar42._0_4_ + iVar8 + auVar108._0_4_ >> auVar286;
  iStack_d0 = auVar42._8_4_ + iVar8 + auVar108._8_4_ >> auVar286;
  iStack_cc = auVar42._12_4_ + iVar8 + auVar108._12_4_ >> auVar286;
  auVar42 = pmulld(auVar112,local_418);
  auVar197._4_4_ = uVar98;
  auVar197._0_4_ = uVar191;
  auVar197._8_4_ = uVar23;
  auVar197._12_4_ = uVar28;
  auVar108 = pmulld(auVar197,auVar173);
  auVar262._0_4_ = uVar191 + local_418._0_4_;
  auVar262._4_4_ = uVar98 + local_418._4_4_;
  auVar262._8_4_ = uVar23 + local_418._8_4_;
  auVar262._12_4_ = uVar28 + local_418._12_4_;
  auVar197 = pmulld(auVar262,auVar173);
  local_c8 = auVar108._0_4_ + iVar8 + auVar42._0_4_ >> auVar286;
  iStack_c4 = auVar108._4_4_ + iVar8 + auVar42._4_4_ >> auVar286;
  iStack_c0 = auVar108._8_4_ + iVar8 + auVar42._8_4_ >> auVar286;
  iStack_bc = auVar108._12_4_ + iVar8 + auVar42._12_4_ >> auVar286;
  local_b8 = auVar197._0_4_ + iVar8 >> auVar286;
  iStack_b4 = auVar197._4_4_ + iVar8 >> auVar286;
  iStack_b0 = auVar197._8_4_ + iVar8 >> auVar286;
  iStack_ac = auVar197._12_4_ + iVar8 >> auVar286;
  iStack_254 = local_258;
  iStack_250 = local_258;
  iStack_24c = local_258;
  iStack_244 = local_248;
  iStack_240 = local_248;
  iStack_23c = local_248;
  idct32_stage9_sse4_1
            ((__m128i *)&local_238,out,do_cols,bd,out_shift,(__m128i *)&local_248,
             (__m128i *)&local_258);
  return;
}

Assistant:

static void idct32x32_low16_sse4_1(__m128i *in, __m128i *out, int bit,
                                   int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);
  const __m128i cospi30 = _mm_set1_epi32(cospi[30]);
  const __m128i cospi46 = _mm_set1_epi32(cospi[46]);
  const __m128i cospi14 = _mm_set1_epi32(cospi[14]);
  const __m128i cospi54 = _mm_set1_epi32(cospi[54]);
  const __m128i cospi22 = _mm_set1_epi32(cospi[22]);
  const __m128i cospi38 = _mm_set1_epi32(cospi[38]);
  const __m128i cospi6 = _mm_set1_epi32(cospi[6]);
  const __m128i cospi26 = _mm_set1_epi32(cospi[26]);
  const __m128i cospi10 = _mm_set1_epi32(cospi[10]);
  const __m128i cospi18 = _mm_set1_epi32(cospi[18]);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospim58 = _mm_set1_epi32(-cospi[58]);
  const __m128i cospim42 = _mm_set1_epi32(-cospi[42]);
  const __m128i cospim50 = _mm_set1_epi32(-cospi[50]);
  const __m128i cospim34 = _mm_set1_epi32(-cospi[34]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i cospim36 = _mm_set1_epi32(-cospi[36]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospim56 = _mm_set1_epi32(-cospi[56]);
  const __m128i cospim24 = _mm_set1_epi32(-cospi[24]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospim32 = _mm_set1_epi32(-cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i rounding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i bf1[32];

  // stage 0
  // stage 1

  bf1[0] = in[0];
  bf1[2] = in[8];
  bf1[4] = in[4];
  bf1[6] = in[12];
  bf1[8] = in[2];
  bf1[10] = in[10];
  bf1[12] = in[6];
  bf1[14] = in[14];
  bf1[16] = in[1];
  bf1[18] = in[9];
  bf1[20] = in[5];
  bf1[22] = in[13];
  bf1[24] = in[3];
  bf1[26] = in[11];
  bf1[28] = in[7];
  bf1[30] = in[15];

  // stage 2
  bf1[31] = half_btf_0_sse4_1(&cospi2, &bf1[16], &rounding, bit);
  bf1[16] = half_btf_0_sse4_1(&cospi62, &bf1[16], &rounding, bit);
  bf1[17] = half_btf_0_sse4_1(&cospim34, &bf1[30], &rounding, bit);
  bf1[30] = half_btf_0_sse4_1(&cospi30, &bf1[30], &rounding, bit);
  bf1[29] = half_btf_0_sse4_1(&cospi18, &bf1[18], &rounding, bit);
  bf1[18] = half_btf_0_sse4_1(&cospi46, &bf1[18], &rounding, bit);
  bf1[19] = half_btf_0_sse4_1(&cospim50, &bf1[28], &rounding, bit);
  bf1[28] = half_btf_0_sse4_1(&cospi14, &bf1[28], &rounding, bit);
  bf1[27] = half_btf_0_sse4_1(&cospi10, &bf1[20], &rounding, bit);
  bf1[20] = half_btf_0_sse4_1(&cospi54, &bf1[20], &rounding, bit);
  bf1[21] = half_btf_0_sse4_1(&cospim42, &bf1[26], &rounding, bit);
  bf1[26] = half_btf_0_sse4_1(&cospi22, &bf1[26], &rounding, bit);
  bf1[25] = half_btf_0_sse4_1(&cospi26, &bf1[22], &rounding, bit);
  bf1[22] = half_btf_0_sse4_1(&cospi38, &bf1[22], &rounding, bit);
  bf1[23] = half_btf_0_sse4_1(&cospim58, &bf1[24], &rounding, bit);
  bf1[24] = half_btf_0_sse4_1(&cospi6, &bf1[24], &rounding, bit);

  // stage 3
  bf1[15] = half_btf_0_sse4_1(&cospi4, &bf1[8], &rounding, bit);
  bf1[8] = half_btf_0_sse4_1(&cospi60, &bf1[8], &rounding, bit);
  bf1[9] = half_btf_0_sse4_1(&cospim36, &bf1[14], &rounding, bit);
  bf1[14] = half_btf_0_sse4_1(&cospi28, &bf1[14], &rounding, bit);
  bf1[13] = half_btf_0_sse4_1(&cospi20, &bf1[10], &rounding, bit);
  bf1[10] = half_btf_0_sse4_1(&cospi44, &bf1[10], &rounding, bit);
  bf1[11] = half_btf_0_sse4_1(&cospim52, &bf1[12], &rounding, bit);
  bf1[12] = half_btf_0_sse4_1(&cospi12, &bf1[12], &rounding, bit);

  addsub_sse4_1(bf1[16], bf1[17], bf1 + 16, bf1 + 17, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[19], bf1[18], bf1 + 19, bf1 + 18, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[20], bf1[21], bf1 + 20, bf1 + 21, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[23], bf1[22], bf1 + 23, bf1 + 22, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[24], bf1[25], bf1 + 24, bf1 + 25, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[27], bf1[26], bf1 + 27, bf1 + 26, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[28], bf1[29], bf1 + 28, bf1 + 29, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[31], bf1[30], bf1 + 31, bf1 + 30, &clamp_lo, &clamp_hi);
  // stage 4
  bf1[7] = half_btf_0_sse4_1(&cospi8, &bf1[4], &rounding, bit);
  bf1[4] = half_btf_0_sse4_1(&cospi56, &bf1[4], &rounding, bit);
  bf1[5] = half_btf_0_sse4_1(&cospim40, &bf1[6], &rounding, bit);
  bf1[6] = half_btf_0_sse4_1(&cospi24, &bf1[6], &rounding, bit);

  addsub_sse4_1(bf1[8], bf1[9], bf1 + 8, bf1 + 9, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[11], bf1[10], bf1 + 11, bf1 + 10, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[12], bf1[13], bf1 + 12, bf1 + 13, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[15], bf1[14], bf1 + 15, bf1 + 14, &clamp_lo, &clamp_hi);

  idct32_stage4_sse4_1(bf1, &cospim8, &cospi56, &cospi8, &cospim56, &cospim40,
                       &cospi24, &cospi40, &cospim24, &rounding, bit);

  // stage 5
  bf1[0] = half_btf_0_sse4_1(&cospi32, &bf1[0], &rounding, bit);
  bf1[1] = bf1[0];
  bf1[3] = half_btf_0_sse4_1(&cospi16, &bf1[2], &rounding, bit);
  bf1[2] = half_btf_0_sse4_1(&cospi48, &bf1[2], &rounding, bit);

  addsub_sse4_1(bf1[4], bf1[5], bf1 + 4, bf1 + 5, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[7], bf1[6], bf1 + 7, bf1 + 6, &clamp_lo, &clamp_hi);

  idct32_stage5_sse4_1(bf1, &cospim16, &cospi48, &cospi16, &cospim48, &clamp_lo,
                       &clamp_hi, &rounding, bit);

  // stage 6
  addsub_sse4_1(bf1[0], bf1[3], bf1 + 0, bf1 + 3, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[1], bf1[2], bf1 + 1, bf1 + 2, &clamp_lo, &clamp_hi);

  idct32_stage6_sse4_1(bf1, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                       &cospim48, &clamp_lo, &clamp_hi, &rounding, bit);

  // stage 7
  idct32_stage7_sse4_1(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);

  // stage 8
  idct32_stage8_sse4_1(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);
  // stage 9
  idct32_stage9_sse4_1(bf1, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
}